

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O3

void snapshot_before_block_reuse_test(bool inmem)

{
  undefined1 auVar1 [16];
  fdb_status s;
  fdb_status fVar2;
  sb_decision_t sVar3;
  int iVar4;
  fdb_status extraout_EAX;
  fdb_status extraout_EAX_00;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  fdb_kvs_handle *pfVar8;
  fdb_kvs_handle *pfVar9;
  fdb_kvs_handle *pfVar10;
  char cVar11;
  ulong uVar12;
  char *pcVar13;
  fdb_config *pfVar14;
  char *pcVar15;
  fdb_doc **doc;
  uint uVar16;
  uint uVar17;
  size_t unaff_RBP;
  size_t sVar18;
  fdb_kvs_handle *pfVar19;
  fdb_kvs_handle **ptr_handle;
  undefined7 in_register_00000039;
  fdb_kvs_handle *unaff_R12;
  uint uVar20;
  ulong unaff_R13;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 handle;
  char *pcVar21;
  fdb_config *pfVar22;
  char *pcVar23;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar24;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar25;
  char *unaff_R15;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *snap_db;
  void *rvalue;
  size_t rvalue_len;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_file_info file_info;
  fdb_config fconfig;
  char bodybuf [256];
  fdb_kvs_handle *pfStackY_27a8;
  fdb_file_handle *pfStackY_27a0;
  fdb_kvs_config fStackY_2798;
  char acStackY_2780 [264];
  fdb_config fStackY_2678;
  char acStackY_2580 [520];
  fdb_doc **ppfStackY_2378;
  size_t sStackY_2368;
  char *pcStackY_2360;
  char *pcStackY_2358;
  code *pcStackY_2350;
  fdb_kvs_handle *pfStack_2340;
  fdb_file_handle *pfStack_2338;
  fdb_iterator *pfStack_2330;
  fdb_doc *pfStack_2328;
  fdb_kvs_handle *pfStack_2320;
  timeval tStack_2318;
  char acStack_2308 [512];
  fdb_kvs_config fStack_2108;
  fdb_file_info fStack_20f0;
  char acStack_20a8 [256];
  fdb_config fStack_1fa8;
  char *pcStack_1eb0;
  fdb_kvs_handle *pfStack_1ea8;
  fdb_kvs_handle *pfStack_1ea0;
  fdb_kvs_handle *pfStack_1e98;
  fdb_kvs_handle *pfStack_1e90;
  fdb_kvs_handle *pfStack_1e88;
  fdb_kvs_handle *pfStack_1e78;
  fdb_file_handle *pfStack_1e70;
  uint uStack_1e64;
  fdb_kvs_info fStack_1e60;
  timeval tStack_1e30;
  fdb_kvs_config fStack_1e20;
  undefined1 auStack_1e08 [80];
  docio_handle *pdStack_1db8;
  btreeblk_handle *pbStack_1db0;
  btree_blk_ops *pbStack_1da8;
  filemgr_ops *pfStack_1da0;
  fdb_config fStack_1d98;
  undefined1 uStack_1bc1;
  fdb_kvs_handle fStack_1bc0;
  fdb_kvs_handle *pfStack_19b8;
  char *pcStack_19b0;
  char *pcStack_19a8;
  fdb_kvs_handle *pfStack_19a0;
  fdb_kvs_handle *pfStack_1998;
  fdb_file_handle *pfStack_1990;
  timeval tStack_1988;
  undefined1 auStack_1978 [536];
  undefined1 auStack_1760 [375];
  undefined1 uStack_15e9;
  fdb_kvs_handle *pfStack_1560;
  undefined8 uStack_1548;
  fdb_kvs_handle *pfStack_1520;
  fdb_kvs_handle *pfStack_1518;
  fdb_kvs_handle *pfStack_1510;
  fdb_kvs_handle *pfStack_1508;
  fdb_kvs_handle *pfStack_1500;
  code *pcStack_14f8;
  fdb_kvs_handle *pfStack_14f0;
  fdb_file_handle *pfStack_14e8;
  fdb_kvs_handle *pfStack_14e0;
  fdb_kvs_handle *pfStack_14d8;
  fdb_kvs_config fStack_14d0;
  timeval tStack_14b8;
  fdb_file_info fStack_14a8;
  fdb_kvs_info fStack_1460;
  undefined1 auStack_1430 [512];
  fdb_kvs_handle fStack_1230;
  size_t sStack_1028;
  char *pcStack_1020;
  char *pcStack_1018;
  code *pcStack_1010;
  fdb_kvs_handle *pfStack_1008;
  fdb_file_handle *pfStack_1000;
  fdb_kvs_info fStack_ff8;
  timeval tStack_fc8;
  fdb_kvs_config fStack_fb8;
  fdb_file_info fStack_fa0;
  char acStack_f58 [256];
  char acStack_e58 [511];
  undefined1 uStack_c59;
  fdb_config fStack_a58;
  char *pcStack_960;
  fdb_config *pfStack_958;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_950;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_948;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_940;
  code *pcStack_938;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_930;
  fdb_file_handle *pfStack_928;
  size_t sStack_920;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_918;
  kvs_info *pkStack_910;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_908;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_900;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_8f8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_8f0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_8e8;
  timeval tStack_8e0;
  undefined1 auStack_8d0 [24];
  fdb_file_info fStack_8b8;
  fdb_config fStack_870;
  fdb_config fStack_770;
  fdb_config *pfStack_678;
  fdb_kvs_handle *pfStack_670;
  ulong uStack_668;
  fdb_config *pfStack_660;
  fdb_file_info *pfStack_658;
  code *pcStack_650;
  fdb_kvs_handle *pfStack_648;
  fdb_file_handle *pfStack_640;
  fdb_kvs_handle *pfStack_638;
  fdb_config *pfStack_630;
  size_t sStack_628;
  fdb_kvs_config fStack_620;
  timeval tStack_608;
  fdb_file_info fStack_5f8;
  fdb_config fStack_5b0;
  fdb_config *pfStack_4b8;
  fdb_kvs_handle *pfStack_4b0;
  fdb_config *pfStack_4a8;
  fdb_file_info *pfStack_4a0;
  code *pcStack_498;
  fdb_kvs_handle *pfStack_490;
  fdb_file_handle *pfStack_488;
  fdb_kvs_handle *pfStack_480;
  fdb_kvs_config fStack_478;
  undefined1 auStack_460 [40];
  fdb_file_info fStack_438;
  fdb_config fStack_3f0;
  ulong uStack_2f8;
  fdb_kvs_handle *pfStack_2f0;
  ulong uStack_2e8;
  fdb_config *pfStack_2e0;
  fdb_file_info *pfStack_2d8;
  code *pcStack_2d0;
  fdb_kvs_handle *local_2c8;
  fdb_file_handle *local_2c0;
  fdb_kvs_handle *local_2b8;
  fdb_config *local_2b0;
  size_t local_2a8;
  fdb_kvs_config local_2a0;
  timeval local_288;
  undefined1 local_278 [280];
  uint8_t local_160 [40];
  char local_138 [264];
  
  uVar12 = CONCAT71(in_register_00000039,inmem) & 0xffffffff;
  pcStack_2d0 = (code *)0x10c048;
  memleak_start();
  pcStack_2d0 = (code *)0x10c054;
  gettimeofday(&local_288,(__timezone_ptr_t)0x0);
  pcVar21 = local_278 + 0x48;
  pcStack_2d0 = (code *)0x10c064;
  fdb_get_default_config();
  pcStack_2d0 = (code *)0x10c06e;
  fdb_get_default_kvs_config();
  pcStack_2d0 = (code *)0x10c07a;
  system("rm -rf  staleblktest* > errorlog.txt");
  local_160[0] = '\x01';
  local_160[1] = '\0';
  local_160[2] = '\0';
  local_160[3] = '\0';
  local_160[4] = '\0';
  local_160[5] = '\0';
  local_160[6] = '\0';
  local_160[7] = '\0';
  pcStack_2d0 = (code *)0x10c099;
  fVar2 = fdb_open(&local_2c0,"./staleblktest1",(fdb_config *)pcVar21);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c39f;
  pcStack_2d0 = (code *)0x10c0b3;
  fVar2 = fdb_kvs_open_default(local_2c0,&local_2c8,&local_2a0);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3a6;
  pcStack_2d0 = (code *)0x10c0dd;
  fVar2 = fdb_set_kv(local_2c8,"key",4,"snp",4);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3ad;
  pcStack_2d0 = (code *)0x10c0f4;
  fVar2 = fdb_commit(local_2c0,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3b4;
  ptr_handle = &local_2b8;
  cVar11 = (char)uVar12;
  pfVar19 = local_2c8;
  if (cVar11 != '\0') {
    pcStack_2d0 = (code *)0x10c115;
    fVar2 = fdb_snapshot_open(local_2c8,ptr_handle,0xffffffffffffffff);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pfVar19 = (fdb_kvs_handle *)(ulong)(uint)fVar2;
      pcStack_2d0 = (code *)0x10c120;
      snapshot_before_block_reuse_test();
      goto LAB_0010c120;
    }
LAB_0010c132:
    unaff_RBP = 0;
    unaff_R12 = (fdb_kvs_handle *)local_278;
    do {
      pcStack_2d0 = (code *)0x10c161;
      fVar2 = fdb_set_kv(local_2c8,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c373;
      pcStack_2d0 = (code *)0x10c176;
      fVar2 = fdb_get_file_info(local_2c0,(fdb_file_info *)unaff_R12);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c36c;
      uVar16 = (int)unaff_RBP + 1;
      unaff_RBP = (size_t)uVar16;
    } while ((ulong)local_278._40_8_ < (fdb_file_handle *)0x1000001);
    unaff_R12 = (fdb_kvs_handle *)0x0;
    pcVar21 = "key";
    unaff_R15 = "val";
    do {
      unaff_R13 = (ulong)uVar16;
      do {
        pcStack_2d0 = (code *)0x10c1b9;
        fVar2 = fdb_set_kv(local_2c8,"key",4,"val",4);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          pcStack_2d0 = (code *)0x10c36c;
          snapshot_before_block_reuse_test();
          goto LAB_0010c36c;
        }
        uVar20 = (int)unaff_R13 - 1;
        unaff_R13 = (ulong)uVar20;
      } while (uVar20 != 0);
      pcStack_2d0 = (code *)0x10c1d5;
      fVar2 = fdb_commit(local_2c0,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c37a;
      uVar20 = (int)unaff_R12 + 1;
      unaff_R12 = (fdb_kvs_handle *)(ulong)uVar20;
    } while (uVar20 != 5);
    pcStack_2d0 = (code *)0x10c1ef;
    sVar3 = sb_check_block_reusing(local_2c8);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010c3bb;
    pcStack_2d0 = (code *)0x10c218;
    fVar2 = fdb_get_kv(local_2b8,"key",4,&local_2b0,&local_2a8);
    pfVar22 = local_2b0;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3c0;
    pcStack_2d0 = (code *)0x10c239;
    iVar4 = bcmp(local_2b0,"snp",local_2a8);
    if (iVar4 != 0) goto LAB_0010c3c7;
    pcStack_2d0 = (code *)0x10c24b;
    fVar2 = fdb_kvs_close(local_2b8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3cf;
    pfVar22 = (fdb_config *)0x147599;
    unaff_R15 = "val";
    do {
      pcStack_2d0 = (code *)0x10c27b;
      fVar2 = fdb_set_kv(local_2c8,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c381;
      uVar16 = (int)unaff_RBP - 1;
      unaff_RBP = (size_t)uVar16;
    } while (uVar16 != 0);
    pcStack_2d0 = (code *)0x10c296;
    fVar2 = fdb_commit(local_2c0,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3d6;
    pcStack_2d0 = (code *)0x10c2b1;
    fVar2 = fdb_snapshot_open(local_2c8,&local_2b8,1);
    if (fVar2 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_0010c388;
    pcStack_2d0 = (code *)0x10c2c4;
    fVar2 = fdb_free_block(local_2b0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3dd;
    pcStack_2d0 = (code *)0x10c2d5;
    fVar2 = fdb_kvs_close(local_2c8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c3e4;
    pcStack_2d0 = (code *)0x10c2e7;
    fVar2 = fdb_close(local_2c0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_2d0 = (code *)0x10c2f4;
      fdb_shutdown();
      pcStack_2d0 = (code *)0x10c2f9;
      memleak_end();
      pcVar21 = "disk snapshot";
      if (cVar11 != '\0') {
        pcVar21 = "in-mem snapshot";
      }
      pcStack_2d0 = (code *)0x10c326;
      sprintf(local_138,"snapshot before block reuse test %s",pcVar21);
      pcVar21 = "%s PASSED\n";
      if (snapshot_before_block_reuse_test(bool)::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pcStack_2d0 = (code *)0x10c353;
      fprintf(_stderr,pcVar21,local_138);
      return;
    }
    goto LAB_0010c3eb;
  }
LAB_0010c120:
  pcStack_2d0 = (code *)0x10c12a;
  fVar2 = fdb_snapshot_open(pfVar19,ptr_handle,1);
  if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0010c132;
LAB_0010c3f2:
  pcStack_2d0 = (code *)0x10c3f9;
  snapshot_before_block_reuse_test();
  goto LAB_0010c3f9;
LAB_0010c36c:
  pcStack_2d0 = (code *)0x10c373;
  snapshot_before_block_reuse_test();
LAB_0010c373:
  pcStack_2d0 = (code *)0x10c37a;
  snapshot_before_block_reuse_test();
LAB_0010c37a:
  pcStack_2d0 = (code *)0x10c381;
  snapshot_before_block_reuse_test();
LAB_0010c381:
  pcStack_2d0 = (code *)0x10c388;
  snapshot_before_block_reuse_test();
  fVar2 = extraout_EAX;
LAB_0010c388:
  unaff_R15 = "val";
  pcVar21 = "key";
  if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010c39a:
    pcStack_2d0 = (code *)0x10c39f;
    snapshot_before_block_reuse_test();
LAB_0010c39f:
    pcStack_2d0 = (code *)0x10c3a6;
    snapshot_before_block_reuse_test();
LAB_0010c3a6:
    pcStack_2d0 = (code *)0x10c3ad;
    snapshot_before_block_reuse_test();
LAB_0010c3ad:
    pcStack_2d0 = (code *)0x10c3b4;
    snapshot_before_block_reuse_test();
LAB_0010c3b4:
    pcStack_2d0 = (code *)0x10c3bb;
    snapshot_before_block_reuse_test();
LAB_0010c3bb:
    pcStack_2d0 = (code *)0x10c3c0;
    snapshot_before_block_reuse_test();
LAB_0010c3c0:
    pfVar22 = (fdb_config *)pcVar21;
    pcStack_2d0 = (code *)0x10c3c7;
    snapshot_before_block_reuse_test();
LAB_0010c3c7:
    pcStack_2d0 = (code *)0x10c3cf;
    snapshot_before_block_reuse_test();
LAB_0010c3cf:
    pcStack_2d0 = (code *)0x10c3d6;
    snapshot_before_block_reuse_test();
LAB_0010c3d6:
    pcStack_2d0 = (code *)0x10c3dd;
    snapshot_before_block_reuse_test();
LAB_0010c3dd:
    pcStack_2d0 = (code *)0x10c3e4;
    snapshot_before_block_reuse_test();
LAB_0010c3e4:
    pcStack_2d0 = (code *)0x10c3eb;
    snapshot_before_block_reuse_test();
LAB_0010c3eb:
    pcStack_2d0 = (code *)0x10c3f2;
    snapshot_before_block_reuse_test();
    pcVar21 = (char *)pfVar22;
    goto LAB_0010c3f2;
  }
  pcStack_2d0 = (code *)0x10c396;
  fVar2 = fdb_kvs_close(local_2b8);
  if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0010c39a;
LAB_0010c3f9:
  pcStack_2d0 = snapshot_after_block_reuse_test;
  snapshot_before_block_reuse_test();
  pcStack_498 = (code *)0x10c416;
  uStack_2f8 = uVar12;
  pfStack_2f0 = unaff_R12;
  uStack_2e8 = unaff_R13;
  pfStack_2e0 = (fdb_config *)pcVar21;
  pfStack_2d8 = (fdb_file_info *)unaff_R15;
  pcStack_2d0 = (code *)unaff_RBP;
  memleak_start();
  pcStack_498 = (code *)0x10c422;
  gettimeofday((timeval *)(auStack_460 + 0x18),(__timezone_ptr_t)0x0);
  pcVar13 = (char *)&fStack_3f0;
  pcStack_498 = (code *)0x10c432;
  fdb_get_default_config();
  pcStack_498 = (code *)0x10c43c;
  fdb_get_default_kvs_config();
  pcStack_498 = (code *)0x10c448;
  system("rm -rf  staleblktest* > errorlog.txt");
  fStack_3f0.compaction_threshold = '\0';
  fStack_3f0.num_keeping_headers = 5;
  pcStack_498 = (code *)0x10c46b;
  fVar2 = fdb_open(&pfStack_488,"./staleblktest1",(fdb_config *)pcVar13);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_498 = (code *)0x10c48c;
    fVar2 = fdb_kvs_open(pfStack_488,&pfStack_490,"num_keep",&fStack_478);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6a9;
    unaff_R13 = 0;
    pcVar13 = "key";
    pcVar21 = "val";
    unaff_R15 = (char *)&fStack_438;
    do {
      pcStack_498 = (code *)0x10c4c4;
      fVar2 = fdb_set_kv(pfStack_490,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010c68d:
        pcStack_498 = (code *)0x10c694;
        snapshot_after_block_reuse_test();
        goto LAB_0010c694;
      }
      pcStack_498 = (code *)0x10c4d9;
      fVar2 = fdb_get_file_info(pfStack_488,(fdb_file_info *)unaff_R15);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcStack_498 = (code *)0x10c68d;
        snapshot_after_block_reuse_test();
        goto LAB_0010c68d;
      }
      unaff_R13 = unaff_R13 - 1;
    } while (fStack_438.file_size < 0x1000001);
    pcStack_498 = (code *)0x10c501;
    fVar2 = fdb_commit(pfStack_488,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6b0;
    pcVar13 = "key%d";
    pcVar21 = auStack_460;
    unaff_R15 = "reu";
    unaff_RBP = 0;
    do {
      pcStack_498 = (code *)0x10c52d;
      sprintf(pcVar21,"key%d",unaff_RBP);
      unaff_R12 = pfStack_490;
      pcStack_498 = (code *)0x10c539;
      sVar5 = strlen(pcVar21);
      pcStack_498 = (code *)0x10c550;
      fVar2 = fdb_set_kv(unaff_R12,pcVar21,sVar5,"reu",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c69b;
      pcStack_498 = (code *)0x10c567;
      fVar2 = fdb_commit(pfStack_488,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c694;
      uVar16 = (int)unaff_RBP + 1;
      unaff_RBP = (size_t)uVar16;
    } while (uVar16 != 10);
    pcVar13 = "key";
    pcVar21 = "val";
    unaff_RBP = unaff_R13 & 0xffffffff;
    do {
      uVar16 = (int)unaff_RBP + 1;
      unaff_RBP = (size_t)uVar16;
      if (uVar16 == 0) goto LAB_0010c5b0;
      pcStack_498 = (code *)0x10c5a5;
      fVar2 = fdb_set_kv(pfStack_490,"key",4,"val",4);
    } while (fVar2 == FDB_RESULT_SUCCESS);
    pcStack_498 = (code *)0x10c5b0;
    snapshot_after_block_reuse_test();
LAB_0010c5b0:
    pcStack_498 = (code *)0x10c5bf;
    fVar2 = fdb_commit(pfStack_488,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6b7;
    pcStack_498 = (code *)0x10c5dd;
    fVar2 = fdb_snapshot_open(pfStack_490,&pfStack_480,6 - unaff_R13);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6be;
    pcStack_498 = (code *)0x10c5ef;
    fVar2 = fdb_kvs_close(pfStack_480);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6c5;
    pcStack_498 = (code *)0x10c60d;
    fVar2 = fdb_snapshot_open(pfStack_490,&pfStack_480,5 - unaff_R13);
    if (fVar2 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_0010c6cc;
    pcStack_498 = (code *)0x10c61f;
    fVar2 = fdb_kvs_close(pfStack_490);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c6d1;
    pcStack_498 = (code *)0x10c631;
    fVar2 = fdb_close(pfStack_488);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_498 = (code *)0x10c63e;
      fdb_shutdown();
      pcStack_498 = (code *)0x10c643;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (snapshot_after_block_reuse_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pcStack_498 = (code *)0x10c674;
      fprintf(_stderr,pcVar21,"snapshot after block reuse test");
      return;
    }
  }
  else {
LAB_0010c6a2:
    pcStack_498 = (code *)0x10c6a9;
    snapshot_after_block_reuse_test();
LAB_0010c6a9:
    pcStack_498 = (code *)0x10c6b0;
    snapshot_after_block_reuse_test();
LAB_0010c6b0:
    pcStack_498 = (code *)0x10c6b7;
    snapshot_after_block_reuse_test();
LAB_0010c6b7:
    pcStack_498 = (code *)0x10c6be;
    snapshot_after_block_reuse_test();
LAB_0010c6be:
    pcStack_498 = (code *)0x10c6c5;
    snapshot_after_block_reuse_test();
LAB_0010c6c5:
    pcStack_498 = (code *)0x10c6cc;
    snapshot_after_block_reuse_test();
LAB_0010c6cc:
    pcStack_498 = (code *)0x10c6d1;
    snapshot_after_block_reuse_test();
LAB_0010c6d1:
    pcStack_498 = (code *)0x10c6d8;
    snapshot_after_block_reuse_test();
  }
  pcStack_498 = snapshot_inmem_before_block_reuse_test;
  snapshot_after_block_reuse_test();
  pcStack_650 = (code *)0x10c6f3;
  pfStack_4b8 = (fdb_config *)pcVar13;
  pfStack_4b0 = unaff_R12;
  pfStack_4a8 = (fdb_config *)pcVar21;
  pfStack_4a0 = (fdb_file_info *)unaff_R15;
  pcStack_498 = (code *)unaff_RBP;
  memleak_start();
  pcStack_650 = (code *)0x10c6ff;
  gettimeofday(&tStack_608,(__timezone_ptr_t)0x0);
  pfVar22 = &fStack_5b0;
  pcStack_650 = (code *)0x10c70f;
  fdb_get_default_config();
  pcStack_650 = (code *)0x10c719;
  fdb_get_default_kvs_config();
  pcStack_650 = (code *)0x10c725;
  system("rm -rf  staleblktest* > errorlog.txt");
  fStack_5b0.num_keeping_headers = 1;
  pcStack_650 = (code *)0x10c744;
  fVar2 = fdb_open(&pfStack_640,"./staleblktest1",pfVar22);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_650 = (code *)0x10c75e;
    fVar2 = fdb_kvs_open_default(pfStack_640,&pfStack_648,&fStack_620);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca0d;
    pcStack_650 = (code *)0x10c788;
    fVar2 = fdb_set_kv(pfStack_648,"key",4,"snp",4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca14;
    pcStack_650 = (code *)0x10c79f;
    fVar2 = fdb_commit(pfStack_640,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca1b;
    pcStack_650 = (code *)0x10c7bc;
    fVar2 = fdb_snapshot_open(pfStack_648,&pfStack_638,0xffffffffffffffff);
    pfVar14 = pfVar22;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca22;
    unaff_RBP = 0;
    unaff_R15 = (char *)&fStack_5f8;
    do {
      pcStack_650 = (code *)0x10c7f3;
      fVar2 = fdb_set_kv(pfStack_648,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c9da;
      pcStack_650 = (code *)0x10c808;
      fVar2 = fdb_get_file_info(pfStack_640,(fdb_file_info *)unaff_R15);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c9d3;
      uVar16 = (int)unaff_RBP + 1;
      unaff_RBP = (size_t)uVar16;
    } while (fStack_5f8.file_size < 0x1000001);
    unaff_R15 = (char *)0x0;
    pfVar14 = (fdb_config *)0x147599;
    pcVar21 = "val";
    do {
      unaff_R12 = (fdb_kvs_handle *)(ulong)uVar16;
      do {
        pcStack_650 = (code *)0x10c84b;
        fVar2 = fdb_set_kv(pfStack_648,"key",4,"val",4);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          pcStack_650 = (code *)0x10c9d3;
          snapshot_inmem_before_block_reuse_test();
          goto LAB_0010c9d3;
        }
        uVar20 = (int)unaff_R12 - 1;
        unaff_R12 = (fdb_kvs_handle *)(ulong)uVar20;
      } while (uVar20 != 0);
      pcStack_650 = (code *)0x10c867;
      fVar2 = fdb_commit(pfStack_640,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c9e1;
      uVar20 = (int)unaff_R15 + 1;
      unaff_R15 = (char *)(ulong)uVar20;
    } while (uVar20 != 5);
    pcStack_650 = (code *)0x10c881;
    sVar3 = sb_check_block_reusing(pfStack_648);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010ca29;
    pcStack_650 = (code *)0x10c8aa;
    fVar2 = fdb_get_kv(pfStack_638,"key",4,&pfStack_630,&sStack_628);
    pfVar22 = pfStack_630;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca2e;
    pcStack_650 = (code *)0x10c8cb;
    iVar4 = bcmp(pfStack_630,"snp",sStack_628);
    if (iVar4 != 0) goto LAB_0010ca35;
    pcStack_650 = (code *)0x10c8dd;
    fVar2 = fdb_kvs_close(pfStack_638);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca3d;
    pfVar22 = (fdb_config *)0x147599;
    pcVar21 = "val";
    do {
      pcStack_650 = (code *)0x10c90d;
      fVar2 = fdb_set_kv(pfStack_648,"key",4,"val",4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010c9e8;
      uVar16 = (int)unaff_RBP - 1;
      unaff_RBP = (size_t)uVar16;
    } while (uVar16 != 0);
    pcStack_650 = (code *)0x10c928;
    fVar2 = fdb_commit(pfStack_640,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca44;
    pcStack_650 = (code *)0x10c943;
    fVar2 = fdb_snapshot_open(pfStack_648,&pfStack_638,1);
    if (fVar2 == FDB_RESULT_NO_DB_INSTANCE) {
      pcStack_650 = (code *)0x10c956;
      fVar2 = fdb_free_block(pfStack_630);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca4b;
      pcStack_650 = (code *)0x10c967;
      fVar2 = fdb_kvs_close(pfStack_648);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010ca52;
      pcStack_650 = (code *)0x10c979;
      fVar2 = fdb_close(pfStack_640);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pcStack_650 = (code *)0x10c986;
        fdb_shutdown();
        pcStack_650 = (code *)0x10c98b;
        memleak_end();
        pcVar21 = "%s PASSED\n";
        if (snapshot_inmem_before_block_reuse_test()::__test_pass != '\0') {
          pcVar21 = "%s FAILED\n";
        }
        pcStack_650 = (code *)0x10c9bc;
        fprintf(_stderr,pcVar21,"snapshot inmem before block reuse test");
        return;
      }
      goto LAB_0010ca59;
    }
LAB_0010c9ef:
    pcVar21 = "val";
    pfVar22 = (fdb_config *)0x147599;
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010ca01:
      pcStack_650 = (code *)0x10ca06;
      snapshot_inmem_before_block_reuse_test();
      goto LAB_0010ca06;
    }
    pcStack_650 = (code *)0x10c9fd;
    fVar2 = fdb_kvs_close(pfStack_638);
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0010ca01;
  }
  else {
LAB_0010ca06:
    pcStack_650 = (code *)0x10ca0d;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca0d:
    pcStack_650 = (code *)0x10ca14;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca14:
    pcStack_650 = (code *)0x10ca1b;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca1b:
    pcStack_650 = (code *)0x10ca22;
    snapshot_inmem_before_block_reuse_test();
    pfVar14 = pfVar22;
LAB_0010ca22:
    pcStack_650 = (code *)0x10ca29;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca29:
    pcStack_650 = (code *)0x10ca2e;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca2e:
    pfVar22 = pfVar14;
    pcStack_650 = (code *)0x10ca35;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca35:
    pcStack_650 = (code *)0x10ca3d;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca3d:
    pcStack_650 = (code *)0x10ca44;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca44:
    pcStack_650 = (code *)0x10ca4b;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca4b:
    pcStack_650 = (code *)0x10ca52;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca52:
    pcStack_650 = (code *)0x10ca59;
    snapshot_inmem_before_block_reuse_test();
LAB_0010ca59:
    pcStack_650 = (code *)0x10ca60;
    snapshot_inmem_before_block_reuse_test();
  }
  pcStack_650 = variable_value_size_test;
  snapshot_inmem_before_block_reuse_test();
  aVar24.seqtree = (btree *)0x0;
  pcStack_938 = (code *)0x10ca87;
  pfStack_678 = pfVar22;
  pfStack_670 = unaff_R12;
  uStack_668 = unaff_R13;
  pfStack_660 = (fdb_config *)pcVar21;
  pfStack_658 = (fdb_file_info *)unaff_R15;
  pcStack_650 = (code *)unaff_RBP;
  gettimeofday(&tStack_8e0,(__timezone_ptr_t)0x0);
  pcStack_938 = (code *)0x10ca8c;
  memleak_start();
  pcStack_938 = (code *)0x10ca96;
  pcVar13 = (char *)operator_new__(0x500000);
  pcVar21 = auStack_8d0;
  pcStack_938 = (code *)0x10caa6;
  fdb_get_default_kvs_config();
  pfVar22 = &fStack_770;
  pcStack_938 = (code *)0x10cab6;
  fdb_get_default_config();
  fStack_770.compaction_threshold = '\0';
  fStack_770.block_reusing_threshold = 0x41;
  pcStack_938 = (code *)0x10cad4;
  system("rm -rf  staleblktest* > errorlog.txt");
  handle.seqtree = (btree *)&pfStack_928;
  pcStack_938 = (code *)0x10caeb;
  fdb_open((fdb_file_handle **)handle.seqtree,"./staleblktest1",pfVar22);
  pcStack_938 = (code *)0x10cafa;
  fdb_kvs_open_default(pfStack_928,(fdb_kvs_handle **)&aStack_930.seqtree,(fdb_kvs_config *)pcVar21)
  ;
  if (fStack_770.num_keeping_headers != 0xffffffffffffffff) {
    pcVar23 = "%d_key";
    pcVar21 = (char *)&fStack_870;
    aVar24.seqtree = (btree *)0x0;
    iVar4 = 0;
    do {
      sStack_920 = CONCAT44(sStack_920._4_4_,iVar4 + 3);
      pfVar22 = (fdb_config *)0x1ff;
      aStack_918 = aVar24;
      do {
        pcStack_938 = (code *)0x10cb40;
        sprintf(pcVar21,"%d_key",(ulong)((int)pfVar22 + 1));
        pcStack_938 = (code *)0x10cb50;
        memset(pcVar13,0x61,(size_t)pfVar22);
        handle = aStack_930;
        pcVar13[(long)pfVar22] = '\0';
        pcStack_938 = (code *)0x10cb61;
        sVar5 = strlen(pcVar21);
        unaff_RBP = sVar5 + 1;
        pcStack_938 = (code *)0x10cb6d;
        sVar5 = strlen(pcVar13);
        pcStack_938 = (code *)0x10cb82;
        fVar2 = fdb_set_kv((fdb_kvs_handle *)handle.seqtree,pcVar21,unaff_RBP,pcVar13,sVar5 + 1);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d063;
        pfVar22 = (fdb_config *)&pfVar22[2].wal_threshold;
      } while (pfVar22 != (fdb_config *)0x7ff);
      pcStack_938 = (code *)0x10cba9;
      fVar2 = fdb_commit(pfStack_928,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d071;
      aVar24.seqtree = (btree *)&(aStack_918.seqtree)->vsize;
      iVar4 = (int)sStack_920;
    } while (aVar24.seqtree < (undefined1 *)(fStack_770.num_keeping_headers + 1));
    aVar24 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)(long)(int)sStack_920;
  }
  pcStack_938 = (code *)0x10cbe5;
  fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_930.seqtree,
                            (fdb_kvs_handle **)&aStack_8f8.seqtree,(fdb_seqnum_t)aVar24);
  sVar18 = unaff_RBP;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    sVar6 = 0xffffffff;
    pcVar21 = "%d_key";
    pfVar22 = &fStack_870;
    handle.seqtree = (btree *)0x0;
LAB_0010cc04:
    unaff_RBP = 0x3ff;
    sStack_920 = sVar6;
    aStack_918 = handle;
LAB_0010cc13:
    pcStack_938 = (code *)0x10cc23;
    sprintf((char *)pfVar22,"%d_key",(ulong)((int)unaff_RBP + 1));
    pcStack_938 = (code *)0x10cc33;
    memset(pcVar13,0x62,unaff_RBP);
    handle = aStack_930;
    pcVar13[unaff_RBP] = '\0';
    pcStack_938 = (code *)0x10cc43;
    sVar5 = strlen((char *)pfVar22);
    pcVar23 = (char *)(sVar5 + 1);
    pcStack_938 = (code *)0x10cc4f;
    sVar5 = strlen(pcVar13);
    pcStack_938 = (code *)0x10cc64;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)handle.seqtree,pfVar22,(size_t)pcVar23,pcVar13,sVar5 + 1);
    if (fVar2 == FDB_RESULT_SUCCESS) goto code_r0x0010cc6c;
    pcStack_938 = (code *)0x10d063;
    variable_value_size_test();
LAB_0010d063:
    pcStack_938 = (code *)0x10d06a;
    variable_value_size_test();
    goto LAB_0010d06a;
  }
LAB_0010d086:
  pcStack_938 = (code *)0x10d08d;
  variable_value_size_test();
LAB_0010d08d:
  pcStack_938 = (code *)0x10d092;
  variable_value_size_test();
LAB_0010d092:
  pcStack_938 = (code *)0x10d099;
  variable_value_size_test();
LAB_0010d099:
  pcStack_938 = (code *)0x10d0a0;
  variable_value_size_test();
LAB_0010d0a0:
  pcStack_938 = (code *)0x10d0a7;
  variable_value_size_test();
LAB_0010d0a7:
  pcStack_938 = (code *)0x10d0ae;
  variable_value_size_test();
LAB_0010d0ae:
  pcStack_938 = (code *)0x10d0b5;
  variable_value_size_test();
LAB_0010d0b5:
  aVar25 = aVar24;
  pcStack_938 = (code *)0x10d0bc;
  variable_value_size_test();
LAB_0010d0bc:
  pcStack_938 = (code *)0x10d0c4;
  variable_value_size_test();
LAB_0010d0c4:
  pcStack_938 = (code *)0x10d0cb;
  variable_value_size_test();
LAB_0010d0cb:
  pcStack_938 = (code *)0x10d0d2;
  variable_value_size_test();
LAB_0010d0d2:
  pcStack_938 = (code *)0x10d0da;
  variable_value_size_test();
LAB_0010d0da:
  pcStack_938 = (code *)0x10d0e1;
  variable_value_size_test();
LAB_0010d0e1:
  pcStack_938 = (code *)0x10d0e8;
  variable_value_size_test();
LAB_0010d0e8:
  pcStack_938 = (code *)0x10d0ef;
  variable_value_size_test();
LAB_0010d0ef:
  pcStack_938 = (code *)0x10d0f6;
  variable_value_size_test();
LAB_0010d0f6:
  pcStack_938 = rollback_with_num_keeping_headers;
  variable_value_size_test();
  pcStack_1010 = (code *)0x10d11a;
  pcStack_960 = pcVar13;
  pfStack_958 = pfVar22;
  aStack_950 = handle;
  aStack_948 = aVar25;
  aStack_940 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar21;
  pcStack_938 = (code *)sVar18;
  gettimeofday(&tStack_fc8,(__timezone_ptr_t)0x0);
  pcStack_1010 = (code *)0x10d11f;
  memleak_start();
  pcStack_1010 = (code *)0x10d12c;
  fdb_get_default_kvs_config();
  pcStack_1010 = (code *)0x10d13c;
  fdb_get_default_config();
  fStack_a58.compaction_threshold = '\0';
  fStack_a58.block_reusing_threshold = 0x41;
  fStack_a58.num_keeping_headers = 1;
  pcStack_1010 = (code *)0x10d163;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStack_1010 = (code *)0x10d17a;
  fdb_open(&pfStack_1000,"./staleblktest1",&fStack_a58);
  pcStack_1010 = (code *)0x10d188;
  fdb_kvs_open_default(pfStack_1000,&pfStack_1008,&fStack_fb8);
  pcVar15 = "%dkey";
  pcVar13 = acStack_f58;
  pcVar23 = acStack_e58;
  pcVar21 = (char *)0x0;
  do {
    pcStack_1010 = (code *)0x10d1b0;
    sprintf(pcVar13,"%dkey",pcVar21);
    pcStack_1010 = (code *)0x10d1c2;
    memset(pcVar23,0x62,0x1ff);
    pfVar19 = pfStack_1008;
    uStack_c59 = 0;
    pcStack_1010 = (code *)0x10d1d6;
    sVar7 = strlen(pcVar13);
    pcStack_1010 = (code *)0x10d1e1;
    sVar5 = strlen(pcVar23);
    pcStack_1010 = (code *)0x10d1f5;
    fVar2 = fdb_set_kv(pfVar19,pcVar13,sVar7,pcVar23,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010d445:
      pcStack_1010 = (code *)0x10d44c;
      rollback_with_num_keeping_headers();
      goto LAB_0010d44c;
    }
    pcStack_1010 = (code *)0x10d20c;
    fVar2 = fdb_commit(pfStack_1000,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_1010 = (code *)0x10d445;
      rollback_with_num_keeping_headers();
      goto LAB_0010d445;
    }
    uVar16 = (int)pcVar21 + 1;
    pcVar21 = (char *)(ulong)uVar16;
  } while (uVar16 != 10);
  pcVar23 = (char *)0x0;
  pcVar21 = acStack_f58;
  pcVar13 = acStack_e58;
  pcVar15 = (char *)0x0;
  do {
    pfVar19 = pfStack_1008;
    builtin_strncpy(acStack_f58,"0key",5);
    builtin_strncpy(acStack_e58,
                    "ccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccc"
                    ,0x80);
    pcStack_1010 = (code *)0x10d29e;
    sVar7 = strlen(pcVar21);
    pcStack_1010 = (code *)0x10d2a9;
    sVar5 = strlen(pcVar13);
    pcStack_1010 = (code *)0x10d2bd;
    fVar2 = fdb_set_kv(pfVar19,pcVar21,sVar7,pcVar13,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d453;
    pcStack_1010 = (code *)0x10d2d4;
    fVar2 = fdb_get_file_info(pfStack_1000,&fStack_fa0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d44c;
    uVar16 = (int)pcVar15 + 1;
    pcVar15 = (char *)(ulong)uVar16;
  } while (fStack_fa0.file_size < 0x1000000);
  pcStack_1010 = (code *)0x10d2f9;
  sVar3 = sb_check_block_reusing(pfStack_1008);
  if (sVar3 == SBD_RECLAIM) {
    pcStack_1010 = (code *)0x10d311;
    fVar2 = fdb_commit(pfStack_1000,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d466;
    pcVar13 = acStack_f58;
    pcVar23 = acStack_e58;
    pcVar21 = (char *)0x0;
    do {
      pcStack_1010 = (code *)0x10d33e;
      sprintf(pcVar13,"%dkey",pcVar21);
      pcStack_1010 = (code *)0x10d350;
      memset(pcVar23,100,0x1ff);
      pfVar19 = pfStack_1008;
      uStack_c59 = 0;
      pcStack_1010 = (code *)0x10d364;
      sVar7 = strlen(pcVar13);
      pcStack_1010 = (code *)0x10d36f;
      sVar5 = strlen(pcVar23);
      pcStack_1010 = (code *)0x10d383;
      fVar2 = fdb_set_kv(pfVar19,pcVar13,sVar7,pcVar23,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d45a;
      uVar20 = (int)pcVar21 + 1;
      pcVar21 = (char *)(ulong)uVar20;
    } while (uVar16 != uVar20);
    pcStack_1010 = (code *)0x10d39e;
    fVar2 = fdb_rollback(&pfStack_1008,10);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d46d;
    pcStack_1010 = (code *)0x10d3b4;
    fVar2 = fdb_get_kvs_info(pfStack_1008,&fStack_ff8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d474;
    if (fStack_ff8.doc_count != 10) {
      pcStack_1010 = (code *)0x10d3ce;
      rollback_with_num_keeping_headers();
    }
    pcStack_1010 = (code *)0x10d3d7;
    fVar2 = fdb_kvs_close(pfStack_1008);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d47b;
    pcStack_1010 = (code *)0x10d3e9;
    fVar2 = fdb_close(pfStack_1000);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_1010 = (code *)0x10d3f6;
      fdb_shutdown();
      pcStack_1010 = (code *)0x10d3fb;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (rollback_with_num_keeping_headers()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pcStack_1010 = (code *)0x10d42c;
      fprintf(_stderr,pcVar21,"rollback with num keeping headers");
      return;
    }
  }
  else {
LAB_0010d461:
    pcStack_1010 = (code *)0x10d466;
    rollback_with_num_keeping_headers();
LAB_0010d466:
    pcStack_1010 = (code *)0x10d46d;
    rollback_with_num_keeping_headers();
LAB_0010d46d:
    pcStack_1010 = (code *)0x10d474;
    rollback_with_num_keeping_headers();
LAB_0010d474:
    pcStack_1010 = (code *)0x10d47b;
    rollback_with_num_keeping_headers();
LAB_0010d47b:
    pcStack_1010 = (code *)0x10d482;
    rollback_with_num_keeping_headers();
  }
  pcStack_1010 = crash_and_recover_with_num_keeping_test;
  rollback_with_num_keeping_headers();
  pcStack_14f8 = (code *)0x10d4a6;
  fStack_1230.bub_ctx.space_used = (uint64_t)pcVar15;
  sStack_1028 = sVar7;
  pcStack_1020 = pcVar13;
  pcStack_1018 = pcVar23;
  pcStack_1010 = (code *)pcVar21;
  gettimeofday(&tStack_14b8,(__timezone_ptr_t)0x0);
  pcStack_14f8 = (code *)0x10d4ab;
  memleak_start();
  pcStack_14f8 = (code *)0x10d4b8;
  fdb_get_default_kvs_config();
  pcStack_14f8 = (code *)0x10d4c8;
  fdb_get_default_config();
  fStack_1230.config.block_reusing_threshold._7_1_ = 0;
  fStack_1230.max_seqnum = 0x41;
  fStack_1230.handle_busy.super___atomic_base<unsigned_char>._M_i =
       (__atomic_base<unsigned_char>)0xa;
  fStack_1230.dirty_updates = '\0';
  fStack_1230._466_6_ = 0;
  pcStack_14f8 = (code *)0x10d4ef;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStack_14f8 = (code *)0x10d506;
  fdb_open(&pfStack_14e8,"./staleblktest1file.1",(fdb_config *)&fStack_1230.config.encryption_key);
  pcStack_14f8 = (code *)0x10d51b;
  fdb_kvs_open(pfStack_14e8,&pfStack_14f0,"./staleblktest1",&fStack_14d0);
  pcVar13 = "%dkey";
  pfVar19 = &fStack_1230;
  pfVar10 = (fdb_kvs_handle *)auStack_1430;
  pcVar21 = (char *)0x0;
  do {
    pcStack_14f8 = (code *)0x10d543;
    sprintf((char *)pfVar19,"%dkey",pcVar21);
    pcStack_14f8 = (code *)0x10d555;
    memset(pfVar10,0x62,0x1ff);
    pfVar9 = pfStack_14f0;
    auStack_1430[0x1ff] = 0;
    pcStack_14f8 = (code *)0x10d569;
    pfVar8 = (fdb_kvs_handle *)strlen((char *)pfVar19);
    pcStack_14f8 = (code *)0x10d574;
    sVar5 = strlen((char *)pfVar10);
    pcStack_14f8 = (code *)0x10d588;
    fVar2 = fdb_set_kv(pfVar9,pfVar19,(size_t)pfVar8,pfVar10,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010d9e8:
      pcStack_14f8 = (code *)0x10d9ef;
      crash_and_recover_with_num_keeping_test();
      goto LAB_0010d9ef;
    }
    pcStack_14f8 = (code *)0x10d59f;
    fVar2 = fdb_commit(pfStack_14e8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_14f8 = (code *)0x10d9e8;
      crash_and_recover_with_num_keeping_test();
      goto LAB_0010d9e8;
    }
    uVar16 = (int)pcVar21 + 1;
    pcVar21 = (char *)(ulong)uVar16;
  } while (uVar16 != 0xb);
  pfVar10 = (fdb_kvs_handle *)0x0;
  pcVar13 = (char *)&fStack_1230;
  pcVar21 = auStack_1430;
  pfVar19 = (fdb_kvs_handle *)0x0;
  do {
    pfVar9 = pfStack_14f0;
    fStack_1230.kvs_config._4_1_ = 0;
    fStack_1230.kvs_config.create_if_missing = true;
    fStack_1230.kvs_config._1_3_ = 0x79656b;
    auStack_1430._0_8_ = 0x6363636363636363;
    auStack_1430._8_8_ = (fdb_custom_cmp_variable)0x6363636363636363;
    auStack_1430._16_8_ = (void *)0x6363636363636363;
    auStack_1430._24_8_ = (kvs_info *)0x6363636363636363;
    auStack_1430._32_8_ = (kvs_ops_stat *)0x6363636363636363;
    auStack_1430._40_7_ = 0x63636363636363;
    auStack_1430[0x2f] = 99;
    auStack_1430._48_7_ = 0x63636363636363;
    auStack_1430[0x37] = 99;
    auStack_1430._56_7_ = 0x63636363636363;
    auStack_1430[0x3f] = 99;
    auStack_1430._64_8_ = (btree *)0x6363636363636363;
    auStack_1430._72_8_ = (filemgr *)0x6363636363636363;
    auStack_1430._80_8_ = (docio_handle *)0x6363636363636363;
    auStack_1430._88_8_ = (btreeblk_handle *)0x6363636363636363;
    auStack_1430._96_8_ = (btree_blk_ops *)0x6363636363636363;
    auStack_1430._104_7_ = 0x63636363636363;
    auStack_1430[0x6f] = 99;
    auStack_1430._112_7_ = 0x63636363636363;
    auStack_1430._119_8_ = 0x6363636363636363;
    auStack_1430[0x7f] = 0;
    pcStack_14f8 = (code *)0x10d632;
    pfVar8 = (fdb_kvs_handle *)strlen(pcVar13);
    pcStack_14f8 = (code *)0x10d63d;
    sVar5 = strlen(pcVar21);
    pcStack_14f8 = (code *)0x10d651;
    fVar2 = fdb_set_kv(pfVar9,pcVar13,(size_t)pfVar8,pcVar21,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d9f6;
    pcStack_14f8 = (code *)0x10d668;
    fVar2 = fdb_get_file_info(pfStack_14e8,&fStack_14a8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d9ef;
    pfVar19 = (fdb_kvs_handle *)(ulong)((int)pfVar19 + 1);
  } while (fStack_14a8.file_size < 0x1000000);
  pcStack_14f8 = (code *)0x10d68b;
  sVar3 = sb_check_block_reusing(pfStack_14f0);
  if (sVar3 == SBD_RECLAIM) {
    pcStack_14f8 = (code *)0x10d6a3;
    fVar2 = fdb_commit(pfStack_14e8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da25;
    pcStack_14f8 = (code *)0x10d6bc;
    fVar2 = fdb_get_kvs_info(pfStack_14f0,&fStack_1460);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da2c;
    pfStack_14e0 = (fdb_kvs_handle *)fStack_1460.last_seqnum;
    pfVar10 = &fStack_1230;
    pfVar9 = (fdb_kvs_handle *)auStack_1430;
    pcVar21 = (char *)0x0;
    do {
      pcStack_14f8 = (code *)0x10d6f6;
      sprintf((char *)pfVar10,"%dkey",pcVar21);
      pfVar8 = pfStack_14f0;
      auStack_1430._0_8_ = 0x6464646464646464;
      auStack_1430._8_8_ = (fdb_custom_cmp_variable)0x6464646464646464;
      auStack_1430._16_8_ = (void *)0x6464646464646464;
      auStack_1430._24_8_ = (kvs_info *)0x6464646464646464;
      auStack_1430._32_8_ = (kvs_ops_stat *)0x6464646464646464;
      auStack_1430._40_7_ = 0x64646464646464;
      auStack_1430[0x2f] = 100;
      auStack_1430._48_7_ = 0x64646464646464;
      auStack_1430[0x37] = 100;
      auStack_1430._56_7_ = 0x64646464646464;
      auStack_1430[0x3f] = 0;
      pcStack_14f8 = (code *)0x10d731;
      pcVar13 = (char *)strlen((char *)pfVar10);
      pcStack_14f8 = (code *)0x10d73c;
      sVar5 = strlen((char *)pfVar9);
      pcStack_14f8 = (code *)0x10d750;
      fVar2 = fdb_set_kv(pfVar8,pfVar10,(size_t)pcVar13,pfVar9,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da04;
      pcStack_14f8 = (code *)0x10d767;
      fVar2 = fdb_commit(pfStack_14e8,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d9fd;
      uVar16 = (int)pcVar21 + 1;
      pcVar21 = (char *)(ulong)uVar16;
    } while (uVar16 != 10);
    pcStack_14f8 = (code *)0x10d783;
    fVar2 = fdb_kvs_close(pfStack_14f0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da33;
    pcStack_14f8 = (code *)0x10d795;
    fVar2 = fdb_close(pfStack_14e8);
    pcVar13 = (char *)pfStack_14e0;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da3a;
    pcStack_14f8 = (code *)0x10d7a7;
    fdb_shutdown();
    pcStack_14f8 = (code *)0x10d7c0;
    fVar2 = fdb_open(&pfStack_14e8,"./staleblktest1file.1",
                     (fdb_config *)&fStack_1230.config.encryption_key);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da41;
    pcStack_14f8 = (code *)0x10d7e1;
    fdb_kvs_open(pfStack_14e8,&pfStack_14f0,"./staleblktest1",&fStack_14d0);
    pcStack_14f8 = (code *)0x10d7f0;
    fVar2 = fdb_get_file_info(pfStack_14e8,&fStack_14a8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da48;
    pcStack_14f8 = (code *)0x10d818;
    iVar4 = _disk_dump("./staleblktest1file.1",fStack_14a8.file_size,
                       (ulong)(((uint)fStack_1230.config.encryption_key.bytes._0_4_ >> 2) +
                              fStack_1230.config.encryption_key.bytes._0_4_ * 2));
    if (iVar4 < 0) goto LAB_0010da4f;
    pcStack_14f8 = (code *)0x10d831;
    fVar2 = fdb_snapshot_open(pfStack_14f0,&pfStack_14d8,(fdb_seqnum_t)pcVar13);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da54;
    pcStack_14f8 = (code *)0x10d844;
    fVar2 = fdb_rollback(&pfStack_14f0,(fdb_seqnum_t)pcVar13);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da5b;
    pcStack_14f8 = (code *)0x10d85d;
    fVar2 = fdb_compact(pfStack_14e8,"./staleblktest1file.3");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da62;
    pcVar13 = "%dkey";
    pfVar9 = &fStack_1230;
    pcVar21 = (char *)0x0;
    do {
      pcStack_14f8 = (code *)0x10d885;
      sprintf((char *)pfVar9,"%dkey",pcVar21);
      pfVar10 = pfStack_14f0;
      pcStack_14f8 = (code *)0x10d891;
      sVar5 = strlen((char *)pfVar9);
      pcStack_14f8 = (code *)0x10d89f;
      fVar2 = fdb_del_kv(pfVar10,pfVar9,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da12;
      pcStack_14f8 = (code *)0x10d8b6;
      fVar2 = fdb_commit(pfStack_14e8,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da0b;
      uVar16 = (int)pcVar21 + 1;
      pcVar21 = (char *)(ulong)uVar16;
    } while (uVar16 != 0xb);
    pcStack_14f8 = (code *)0x10d8ce;
    sVar3 = sb_check_block_reusing(pfStack_14f0);
    if (sVar3 != SBD_NONE) goto LAB_0010da69;
    pcVar21 = (char *)0x0;
    pcVar13 = auStack_1430;
    pfVar8 = &fStack_1230;
    do {
      fStack_1230.kvs_config._4_1_ = 0;
      fStack_1230.kvs_config.create_if_missing = true;
      fStack_1230.kvs_config._1_3_ = 0x79656b;
      pcStack_14f8 = (code *)0x10d90d;
      memset(pcVar13,0x65,0x1ff);
      pfVar10 = pfStack_14f0;
      auStack_1430[0x1ff] = 0;
      pcStack_14f8 = (code *)0x10d921;
      pfVar9 = (fdb_kvs_handle *)strlen((char *)pfVar8);
      pcStack_14f8 = (code *)0x10d92c;
      sVar5 = strlen(pcVar13);
      pcStack_14f8 = (code *)0x10d940;
      fVar2 = fdb_set_kv(pfVar10,pfVar8,(size_t)pfVar9,pcVar13,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da19;
      uVar16 = (int)pfVar19 - 1;
      pfVar19 = (fdb_kvs_handle *)(ulong)uVar16;
    } while (uVar16 != 0);
    pcStack_14f8 = (code *)0x10d956;
    sVar3 = sb_check_block_reusing(pfStack_14f0);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010da6e;
    pcStack_14f8 = (code *)0x10d969;
    fVar2 = fdb_kvs_close(pfStack_14d8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da73;
    pcStack_14f8 = (code *)0x10d97a;
    fVar2 = fdb_kvs_close(pfStack_14f0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010da7a;
    pcStack_14f8 = (code *)0x10d98c;
    fVar2 = fdb_close(pfStack_14e8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_14f8 = (code *)0x10d999;
      fdb_shutdown();
      pcStack_14f8 = (code *)0x10d99e;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (crash_and_recover_with_num_keeping_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pcStack_14f8 = (code *)0x10d9cf;
      fprintf(_stderr,pcVar21,"crash and recover with num keeping test");
      return;
    }
  }
  else {
LAB_0010da20:
    pcStack_14f8 = (code *)0x10da25;
    crash_and_recover_with_num_keeping_test();
LAB_0010da25:
    pcStack_14f8 = (code *)0x10da2c;
    crash_and_recover_with_num_keeping_test();
LAB_0010da2c:
    pcStack_14f8 = (code *)0x10da33;
    crash_and_recover_with_num_keeping_test();
LAB_0010da33:
    pcStack_14f8 = (code *)0x10da3a;
    crash_and_recover_with_num_keeping_test();
LAB_0010da3a:
    pcStack_14f8 = (code *)0x10da41;
    crash_and_recover_with_num_keeping_test();
LAB_0010da41:
    pcStack_14f8 = (code *)0x10da48;
    crash_and_recover_with_num_keeping_test();
LAB_0010da48:
    pcStack_14f8 = (code *)0x10da4f;
    crash_and_recover_with_num_keeping_test();
LAB_0010da4f:
    pcStack_14f8 = (code *)0x10da54;
    crash_and_recover_with_num_keeping_test();
LAB_0010da54:
    pcStack_14f8 = (code *)0x10da5b;
    crash_and_recover_with_num_keeping_test();
LAB_0010da5b:
    pcStack_14f8 = (code *)0x10da62;
    crash_and_recover_with_num_keeping_test();
LAB_0010da62:
    pcStack_14f8 = (code *)0x10da69;
    crash_and_recover_with_num_keeping_test();
LAB_0010da69:
    pcStack_14f8 = (code *)0x10da6e;
    crash_and_recover_with_num_keeping_test();
LAB_0010da6e:
    pcStack_14f8 = (code *)0x10da73;
    crash_and_recover_with_num_keeping_test();
LAB_0010da73:
    pcStack_14f8 = (code *)0x10da7a;
    crash_and_recover_with_num_keeping_test();
LAB_0010da7a:
    pcStack_14f8 = (code *)0x10da81;
    crash_and_recover_with_num_keeping_test();
  }
  pcStack_14f8 = reuse_on_delete_test;
  crash_and_recover_with_num_keeping_test();
  pfStack_19a0 = (fdb_kvs_handle *)0x10daa5;
  pfStack_1520 = (fdb_kvs_handle *)pcVar13;
  pfStack_1518 = pfVar9;
  pfStack_1510 = pfVar8;
  pfStack_1508 = pfVar19;
  pfStack_1500 = pfVar10;
  pcStack_14f8 = (code *)pcVar21;
  gettimeofday(&tStack_1988,(__timezone_ptr_t)0x0);
  pfStack_19a0 = (fdb_kvs_handle *)0x10daaa;
  memleak_start();
  pfStack_19a0 = (fdb_kvs_handle *)0x10daba;
  fdb_get_default_kvs_config();
  pfStack_19a0 = (fdb_kvs_handle *)0x10daca;
  fdb_get_default_config();
  uStack_15e9 = 0;
  pfStack_1560 = (fdb_kvs_handle *)0x41;
  uStack_1548 = 10;
  pfStack_19a0 = (fdb_kvs_handle *)0x10daf1;
  system("rm -rf  staleblktest* > errorlog.txt");
  pfStack_19a0 = (fdb_kvs_handle *)0x10db08;
  fdb_open(&pfStack_1990,"./staleblktest1",(fdb_config *)(auStack_1760 + 0x148));
  pfStack_19a0 = (fdb_kvs_handle *)0x10db16;
  fdb_kvs_open_default(pfStack_1990,&pfStack_1998,(fdb_kvs_config *)(auStack_1978 + 0x200));
  pcVar23 = "%dkey";
  pcVar13 = auStack_1760 + 0x48;
  pcVar21 = auStack_1978;
  pfVar19 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_19a0 = (fdb_kvs_handle *)0x10db3b;
    sprintf(pcVar13,"%dkey",pfVar19);
    pfStack_19a0 = (fdb_kvs_handle *)0x10db4d;
    memset(pcVar21,0x62,0x1ff);
    pfVar10 = pfStack_1998;
    auStack_1978[0x1ff] = 0;
    pfStack_19a0 = (fdb_kvs_handle *)0x10db61;
    pfVar9 = (fdb_kvs_handle *)strlen(pcVar13);
    pfStack_19a0 = (fdb_kvs_handle *)0x10db6c;
    sVar5 = strlen(pcVar21);
    pfStack_19a0 = (fdb_kvs_handle *)0x10db80;
    fVar2 = fdb_set_kv(pfVar10,pcVar13,(size_t)pfVar9,pcVar21,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010de19:
      pfStack_19a0 = (fdb_kvs_handle *)0x10de20;
      reuse_on_delete_test();
      goto LAB_0010de20;
    }
    pfStack_19a0 = (fdb_kvs_handle *)0x10db97;
    fVar2 = fdb_commit(pfStack_1990,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pfStack_19a0 = (fdb_kvs_handle *)0x10de19;
      reuse_on_delete_test();
      goto LAB_0010de19;
    }
    uVar16 = (int)pfVar19 + 1;
    pfVar19 = (fdb_kvs_handle *)(ulong)uVar16;
  } while (uVar16 != 0xb);
  pcVar21 = auStack_1760 + 0x48;
  pfVar10 = (fdb_kvs_handle *)auStack_1978;
  pfVar9 = (fdb_kvs_handle *)auStack_1760;
  pcVar23 = (char *)(fdb_kvs_handle *)0x0;
  do {
    pfVar8 = (fdb_kvs_handle *)pcVar23;
    pfStack_19a0 = (fdb_kvs_handle *)0x10dbd0;
    sprintf(pcVar21,"%dkey",pfVar8);
    pfVar19 = pfStack_1998;
    auStack_1978._0_8_ = 0x6363636363636363;
    auStack_1978._8_8_ = (fdb_custom_cmp_variable)0x6363636363636363;
    auStack_1978._16_8_ = (void *)0x6363636363636363;
    auStack_1978._24_8_ = (kvs_info *)0x6363636363636363;
    auStack_1978._32_8_ = (kvs_ops_stat *)0x6363636363636363;
    auStack_1978._40_8_ = (fdb_file_handle *)0x6363636363636363;
    auStack_1978._48_8_ = (hbtrie *)0x6363636363636363;
    auStack_1978._56_8_ = (btree *)0x6363636363636363;
    auStack_1978._64_8_ = (btree *)0x6363636363636363;
    auStack_1978._72_8_ = (filemgr *)0x6363636363636363;
    auStack_1978._80_8_ = (docio_handle *)0x6363636363636363;
    auStack_1978._88_8_ = (btreeblk_handle *)0x6363636363636363;
    auStack_1978._96_8_ = (btree_blk_ops *)0x6363636363636363;
    auStack_1978._104_7_ = 0x63636363636363;
    auStack_1978[0x6f] = 99;
    auStack_1978._112_7_ = 0x63636363636363;
    auStack_1978._119_8_ = 0x6363636363636363;
    auStack_1978[0x7f] = 0;
    pfStack_19a0 = (fdb_kvs_handle *)0x10dc19;
    pcVar13 = (char *)strlen(pcVar21);
    pfStack_19a0 = (fdb_kvs_handle *)0x10dc24;
    sVar5 = strlen((char *)pfVar10);
    pfStack_19a0 = (fdb_kvs_handle *)0x10dc38;
    fVar2 = fdb_set_kv(pfVar19,pcVar21,(size_t)pcVar13,pfVar10,sVar5);
    pcVar23 = (char *)pfVar8;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de27;
    pfStack_19a0 = (fdb_kvs_handle *)0x10dc4d;
    fVar2 = fdb_get_file_info(pfStack_1990,(fdb_file_info *)pfVar9);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de20;
    uVar16 = (uint)pfVar8 + 1;
    pcVar23 = (char *)(ulong)uVar16;
  } while ((ulong)auStack_1760._40_8_ < (fdb_file_handle *)0x1000000);
  pfStack_19a0 = (fdb_kvs_handle *)0x10dc72;
  sVar3 = sb_check_block_reusing(pfStack_1998);
  if (sVar3 == SBD_NONE) {
    pfStack_19a0 = (fdb_kvs_handle *)0x10dc89;
    fVar2 = fdb_commit(pfStack_1990,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de41;
    pcVar13 = "%dkey";
    pcVar21 = auStack_1760 + 0x48;
    pfVar19 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_19a0 = (fdb_kvs_handle *)0x10dcb5;
      sprintf(pcVar21,"%dkey",pfVar19);
      pfVar10 = pfStack_1998;
      pfStack_19a0 = (fdb_kvs_handle *)0x10dcc1;
      sVar5 = strlen(pcVar21);
      pfStack_19a0 = (fdb_kvs_handle *)0x10dccf;
      fVar2 = fdb_del_kv(pfVar10,pcVar21,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de2e;
      uVar20 = (int)pfVar19 + 1;
      pfVar19 = (fdb_kvs_handle *)(ulong)uVar20;
    } while (uVar16 != uVar20);
    pfStack_19a0 = (fdb_kvs_handle *)0x10dce6;
    sVar3 = sb_check_block_reusing(pfStack_1998);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010de48;
    if (2 < (uint)pfVar8) {
      pcVar23 = (char *)(ulong)(uVar16 >> 2);
      pcVar21 = auStack_1760 + 0x48;
      pfVar10 = (fdb_kvs_handle *)auStack_1978;
      pfVar19 = (fdb_kvs_handle *)0x0;
      do {
        pfStack_19a0 = (fdb_kvs_handle *)0x10dd1e;
        sprintf(pcVar21,"%dkey",pfVar19);
        pfVar8 = pfStack_1998;
        auStack_1978._0_8_ = 0x6464646464646464;
        auStack_1978._8_8_ = (fdb_custom_cmp_variable)0x6464646464646464;
        auStack_1978._16_8_ = (void *)0x6464646464646464;
        auStack_1978._24_8_ = (kvs_info *)0x6464646464646464;
        auStack_1978._32_8_ = (kvs_ops_stat *)0x6464646464646464;
        auStack_1978._40_8_ = (fdb_file_handle *)0x6464646464646464;
        auStack_1978._48_8_ = (hbtrie *)0x6464646464646464;
        auStack_1978._56_8_ = (btree *)0x6464646464646464;
        auStack_1978._64_8_ = (btree *)0x6464646464646464;
        auStack_1978._72_8_ = (filemgr *)0x6464646464646464;
        auStack_1978._80_8_ = (docio_handle *)0x6464646464646464;
        auStack_1978._88_8_ = (btreeblk_handle *)0x6464646464646464;
        auStack_1978._96_8_ = (btree_blk_ops *)0x6464646464646464;
        auStack_1978._104_7_ = 0x64646464646464;
        auStack_1978[0x6f] = 100;
        auStack_1978._112_7_ = 0x64646464646464;
        auStack_1978._119_8_ = 0x6464646464646464;
        auStack_1978[0x7f] = 0;
        pfStack_19a0 = (fdb_kvs_handle *)0x10dd67;
        pcVar13 = (char *)strlen(pcVar21);
        pfStack_19a0 = (fdb_kvs_handle *)0x10dd72;
        sVar5 = strlen((char *)pfVar10);
        pfStack_19a0 = (fdb_kvs_handle *)0x10dd86;
        fVar2 = fdb_set_kv(pfVar8,pcVar21,(size_t)pcVar13,pfVar10,sVar5);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de35;
        uVar20 = (int)pfVar19 + 2;
        pfVar19 = (fdb_kvs_handle *)(ulong)uVar20;
      } while (uVar20 < uVar16 >> 2);
    }
    pcVar21 = auStack_1760 + 0x48;
    pfStack_19a0 = (fdb_kvs_handle *)0x10dda2;
    sVar3 = sb_check_block_reusing(pfStack_1998);
    if (sVar3 != SBD_RECLAIM) goto LAB_0010de4d;
    pfStack_19a0 = (fdb_kvs_handle *)0x10ddb5;
    fVar2 = fdb_close(pfStack_1990);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010de52;
    pfStack_19a0 = (fdb_kvs_handle *)0x10ddc2;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_19a0 = (fdb_kvs_handle *)0x10ddcf;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (reuse_on_delete_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pfStack_19a0 = (fdb_kvs_handle *)0x10de00;
      fprintf(_stderr,pcVar21,"reuse on delete test");
      return;
    }
  }
  else {
LAB_0010de3c:
    pfStack_19a0 = (fdb_kvs_handle *)0x10de41;
    reuse_on_delete_test();
LAB_0010de41:
    pfVar8 = pfVar9;
    pfStack_19a0 = (fdb_kvs_handle *)0x10de48;
    reuse_on_delete_test();
LAB_0010de48:
    pfStack_19a0 = (fdb_kvs_handle *)0x10de4d;
    reuse_on_delete_test();
LAB_0010de4d:
    pfStack_19a0 = (fdb_kvs_handle *)0x10de52;
    reuse_on_delete_test();
LAB_0010de52:
    pfStack_19a0 = (fdb_kvs_handle *)0x10de59;
    reuse_on_delete_test();
  }
  pfStack_19a0 = (fdb_kvs_handle *)fragmented_reuse_test;
  reuse_on_delete_test();
  pfStack_1e88 = (fdb_kvs_handle *)0x10de7d;
  fStack_1bc0.bub_ctx.space_used = (uint64_t)pcVar23;
  fStack_1bc0.bub_ctx.handle = pfVar10;
  pfStack_19b8 = pfVar8;
  pcStack_19b0 = pcVar13;
  pcStack_19a8 = pcVar21;
  pfStack_19a0 = pfVar19;
  gettimeofday(&tStack_1e30,(__timezone_ptr_t)0x0);
  pfStack_1e88 = (fdb_kvs_handle *)0x10de82;
  memleak_start();
  pfStack_1e88 = (fdb_kvs_handle *)0x10de8f;
  fdb_get_default_kvs_config();
  pfStack_1e88 = (fdb_kvs_handle *)0x10de9f;
  fdb_get_default_config();
  fStack_1bc0.config.block_reusing_threshold._7_1_ = 0;
  fStack_1bc0.max_seqnum = 0x23;
  fStack_1bc0.handle_busy.super___atomic_base<unsigned_char>._M_i =
       (__atomic_base<unsigned_char>)0xa;
  fStack_1bc0.dirty_updates = '\0';
  fStack_1bc0._466_6_ = 0;
  pfStack_1e88 = (fdb_kvs_handle *)0x10dec6;
  system("rm -rf  staleblktest* > errorlog.txt");
  pfStack_1e88 = (fdb_kvs_handle *)0x10dedd;
  fdb_open(&pfStack_1e70,"./staleblktest1",(fdb_config *)&fStack_1bc0.config.encryption_key);
  pfStack_1e88 = (fdb_kvs_handle *)0x10deed;
  fdb_kvs_open_default(pfStack_1e70,&pfStack_1e78,&fStack_1e20);
  pcVar23 = "%dkey";
  pcVar21 = (char *)&fStack_1bc0;
  pcVar13 = auStack_1e08 + 0x48;
  pfVar19 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1e88 = (fdb_kvs_handle *)0x10df15;
    sprintf(pcVar21,"%dkey",pfVar19);
    pfStack_1e88 = (fdb_kvs_handle *)0x10df27;
    memset(pcVar13,0x61,0x1ff);
    pfVar9 = pfStack_1e78;
    uStack_1bc1 = 0;
    pfStack_1e88 = (fdb_kvs_handle *)0x10df3c;
    pfVar10 = (fdb_kvs_handle *)strlen(pcVar21);
    pfStack_1e88 = (fdb_kvs_handle *)0x10df47;
    sVar5 = strlen(pcVar13);
    pfStack_1e88 = (fdb_kvs_handle *)0x10df5b;
    fVar2 = fdb_set_kv(pfVar9,pcVar21,(size_t)pfVar10,pcVar13,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0010e2c3:
      pfStack_1e88 = (fdb_kvs_handle *)0x10e2ca;
      fragmented_reuse_test();
      goto LAB_0010e2ca;
    }
    pfStack_1e88 = (fdb_kvs_handle *)0x10df72;
    fVar2 = fdb_commit(pfStack_1e70,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pfStack_1e88 = (fdb_kvs_handle *)0x10e2c3;
      fragmented_reuse_test();
      goto LAB_0010e2c3;
    }
    uVar16 = (int)pfVar19 + 1;
    pfVar19 = (fdb_kvs_handle *)(ulong)uVar16;
  } while (uVar16 != 0xb);
  pcVar13 = (char *)&fStack_1bc0;
  pfVar9 = (fdb_kvs_handle *)(auStack_1e08 + 0x48);
  pfVar10 = (fdb_kvs_handle *)auStack_1e08;
  pcVar23 = (char *)0x0;
  do {
    uVar16 = (uint)pcVar23;
    pfStack_1e88 = (fdb_kvs_handle *)0x10dfab;
    sprintf(pcVar13,"%dkey",pcVar23);
    pfVar19 = pfStack_1e78;
    auStack_1e08._72_8_ = (filemgr *)0x6262626262626262;
    pdStack_1db8 = (docio_handle *)0x6262626262626262;
    pbStack_1db0 = (btreeblk_handle *)0x6262626262626262;
    pbStack_1da8 = (btree_blk_ops *)0x6262626262626262;
    pfStack_1da0 = (filemgr_ops *)0x6262626262626262;
    fStack_1d98.chunksize = 0x6262;
    fStack_1d98._2_2_ = 0x6262;
    fStack_1d98.blocksize = 0x62626262;
    fStack_1d98.buffercache_size = 0x6262626262626262;
    fStack_1d98.wal_threshold = 0x6262626262626262;
    fStack_1d98.wal_flush_before_commit = true;
    fStack_1d98.auto_commit = true;
    fStack_1d98._26_2_ = 0x6262;
    fStack_1d98.purging_interval = 0x62626262;
    fStack_1d98.seqtree_opt = 'b';
    fStack_1d98.durability_opt = 'b';
    fStack_1d98._34_2_ = 0x6262;
    fStack_1d98.flags = 0x62626262;
    fStack_1d98.compaction_buf_maxsize = 0x62626262;
    fStack_1d98.cleanup_cache_onclose = true;
    fStack_1d98.compress_document_body = true;
    fStack_1d98.compaction_mode = 'b';
    fStack_1d98.compaction_threshold = 'b';
    fStack_1d98.compaction_minimum_filesize = 0x6262626262626262;
    fStack_1d98.compactor_sleep_duration = 0x6262626262626262;
    fStack_1d98.multi_kv_instances = true;
    fStack_1d98._65_6_ = 0x626262626262;
    fStack_1d98._71_1_ = 0x62;
    fStack_1d98.prefetch_duration._0_7_ = 0x62626262626262;
    fStack_1d98._79_8_ = 0x6262626262626262;
    fStack_1d98._87_1_ = 0;
    pfStack_1e88 = (fdb_kvs_handle *)0x10e007;
    pcVar21 = (char *)strlen(pcVar13);
    pfStack_1e88 = (fdb_kvs_handle *)0x10e012;
    sVar5 = strlen((char *)pfVar9);
    pfStack_1e88 = (fdb_kvs_handle *)0x10e026;
    fVar2 = fdb_set_kv(pfVar19,pcVar13,(size_t)pcVar21,pfVar9,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2d1;
    pfStack_1e88 = (fdb_kvs_handle *)0x10e03b;
    fVar2 = fdb_get_file_info(pfStack_1e70,(fdb_file_info *)pfVar10);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2ca;
    uVar20 = uVar16 + 1;
    pcVar23 = (char *)(ulong)uVar20;
  } while ((ulong)auStack_1e08._40_8_ < (fdb_file_handle *)0x1000000);
  uStack_1e64 = uVar16;
  if (2 < uVar16) {
    uVar16 = (uVar20 >> 2) + (uint)(uVar20 >> 2 == 0);
    pfVar10 = (fdb_kvs_handle *)(ulong)uVar16;
    pcVar21 = "%dkey";
    pcVar13 = (char *)&fStack_1bc0;
    pfVar19 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_1e88 = (fdb_kvs_handle *)0x10e092;
      sprintf(pcVar13,"%dkey",pfVar19);
      pfVar9 = pfStack_1e78;
      pfStack_1e88 = (fdb_kvs_handle *)0x10e09f;
      sVar5 = strlen(pcVar13);
      pfStack_1e88 = (fdb_kvs_handle *)0x10e0ad;
      fVar2 = fdb_del_kv(pfVar9,pcVar13,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2df;
      uVar17 = (int)pfVar19 + 1;
      pfVar19 = (fdb_kvs_handle *)(ulong)uVar17;
    } while (uVar16 != uVar17);
  }
  pcVar13 = (char *)&fStack_1bc0;
  pfStack_1e88 = (fdb_kvs_handle *)0x10e0c6;
  sVar3 = sb_check_block_reusing(pfStack_1e78);
  if (sVar3 == SBD_NONE) {
    pcVar13 = (char *)(pfStack_1e78->file->pos).super___atomic_base<unsigned_long>._M_i;
    pfStack_1e88 = (fdb_kvs_handle *)0x10e0ec;
    fVar2 = fdb_compact(pfStack_1e70,"staleblktest_compact");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2f9;
    pfStack_1e88 = (fdb_kvs_handle *)0x10e103;
    fVar2 = fdb_get_kvs_info(pfStack_1e78,&fStack_1e60);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e300;
    if (fStack_1e60.doc_count == 0) {
      pfStack_1e88 = (fdb_kvs_handle *)0x10e11d;
      fragmented_reuse_test();
    }
    pcVar21 = (char *)(ulong)(uVar20 >> 2);
    if (pcVar13 <=
        (fdb_kvs_handle *)(pfStack_1e78->file->pos).super___atomic_base<unsigned_long>._M_i) {
      pfStack_1e88 = (fdb_kvs_handle *)0x10e143;
      fragmented_reuse_test();
    }
    uVar16 = uVar20 >> 1;
    pfVar19 = (fdb_kvs_handle *)(ulong)uVar16;
    if (uVar20 >> 2 < uVar16) {
      pcVar13 = "%dkey";
      pfVar9 = &fStack_1bc0;
      do {
        pfStack_1e88 = (fdb_kvs_handle *)0x10e16b;
        sprintf((char *)pfVar9,"%dkey",pcVar21);
        pfVar10 = pfStack_1e78;
        pfStack_1e88 = (fdb_kvs_handle *)0x10e178;
        sVar5 = strlen((char *)pfVar9);
        pfStack_1e88 = (fdb_kvs_handle *)0x10e186;
        fVar2 = fdb_del_kv(pfVar10,pfVar9,sVar5);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2e6;
        uVar17 = (int)pcVar21 + 1;
        pcVar21 = (char *)(ulong)uVar17;
      } while (uVar17 < uVar16);
    }
    pfStack_1e88 = (fdb_kvs_handle *)0x10e1a0;
    sVar3 = sb_check_block_reusing(pfStack_1e78);
    if (sVar3 != SBD_NONE) goto LAB_0010e307;
    if (uVar16 <= uStack_1e64) {
      pcVar21 = "%dkey";
      pcVar13 = (char *)&fStack_1bc0;
      do {
        pfStack_1e88 = (fdb_kvs_handle *)0x10e1cc;
        sprintf(pcVar13,"%dkey",pfVar19);
        pfVar9 = pfStack_1e78;
        pfStack_1e88 = (fdb_kvs_handle *)0x10e1d9;
        sVar5 = strlen(pcVar13);
        pfStack_1e88 = (fdb_kvs_handle *)0x10e1e7;
        fVar2 = fdb_del_kv(pfVar9,pcVar13,sVar5);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2ed;
        uVar16 = (int)pfVar19 + 1;
        pfVar19 = (fdb_kvs_handle *)(ulong)uVar16;
      } while (uVar20 != uVar16);
    }
    pcVar23 = (char *)0xb;
    do {
      pfStack_1e88 = (fdb_kvs_handle *)0x10e209;
      fVar2 = fdb_commit(pfStack_1e70,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e2d8;
      uVar16 = (int)pcVar23 - 1;
      pcVar23 = (char *)(ulong)uVar16;
    } while (uVar16 != 0);
    pfStack_1e88 = (fdb_kvs_handle *)0x10e224;
    fVar2 = fdb_get_kvs_info(pfStack_1e78,&fStack_1e60);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e30c;
    pfStack_1e88 = (fdb_kvs_handle *)0x10e236;
    sVar3 = sb_check_block_reusing(pfStack_1e78);
    if (sVar3 == SBD_NONE) goto LAB_0010e313;
    pfStack_1e88 = (fdb_kvs_handle *)0x10e24d;
    fVar2 = fdb_commit(pfStack_1e70,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e318;
    pfStack_1e88 = (fdb_kvs_handle *)0x10e25f;
    fVar2 = fdb_close(pfStack_1e70);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e31f;
    pfStack_1e88 = (fdb_kvs_handle *)0x10e26c;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_1e88 = (fdb_kvs_handle *)0x10e279;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (fragmented_reuse_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pfStack_1e88 = (fdb_kvs_handle *)0x10e2aa;
      fprintf(_stderr,pcVar21,"fragmented reuse test");
      return;
    }
  }
  else {
LAB_0010e2f4:
    pfStack_1e88 = (fdb_kvs_handle *)0x10e2f9;
    fragmented_reuse_test();
LAB_0010e2f9:
    pfStack_1e88 = (fdb_kvs_handle *)0x10e300;
    fragmented_reuse_test();
LAB_0010e300:
    pfStack_1e88 = (fdb_kvs_handle *)0x10e307;
    fragmented_reuse_test();
LAB_0010e307:
    pfStack_1e88 = (fdb_kvs_handle *)0x10e30c;
    fragmented_reuse_test();
LAB_0010e30c:
    pfStack_1e88 = (fdb_kvs_handle *)0x10e313;
    fragmented_reuse_test();
LAB_0010e313:
    pfStack_1e88 = (fdb_kvs_handle *)0x10e318;
    fragmented_reuse_test();
LAB_0010e318:
    pfStack_1e88 = (fdb_kvs_handle *)0x10e31f;
    fragmented_reuse_test();
LAB_0010e31f:
    pfStack_1e88 = (fdb_kvs_handle *)0x10e326;
    fragmented_reuse_test();
  }
  pfStack_1e88 = (fdb_kvs_handle *)enter_reuse_via_separate_kvs_test;
  fragmented_reuse_test();
  pcStackY_2350 = (code *)0x10e34a;
  pcStack_1eb0 = pcVar23;
  pfStack_1ea8 = pfVar9;
  pfStack_1ea0 = pfVar10;
  pfStack_1e98 = (fdb_kvs_handle *)pcVar21;
  pfStack_1e90 = (fdb_kvs_handle *)pcVar13;
  pfStack_1e88 = pfVar19;
  gettimeofday(&tStack_2318,(__timezone_ptr_t)0x0);
  pcStackY_2350 = (code *)0x10e34f;
  memleak_start();
  pfStack_2328 = (fdb_doc *)0x0;
  pcStackY_2350 = (code *)0x10e368;
  fdb_get_default_kvs_config();
  pcStackY_2350 = (code *)0x10e378;
  fdb_get_default_config();
  fStack_1fa8.compaction_threshold = '\0';
  fStack_1fa8.block_reusing_threshold = 0x23;
  fStack_1fa8.num_keeping_headers = 10;
  pcStackY_2350 = (code *)0x10e39f;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStackY_2350 = (code *)0x10e3b6;
  fdb_open(&pfStack_2338,"./staleblktest1",&fStack_1fa8);
  pcStackY_2350 = (code *)0x10e3cd;
  fdb_kvs_open(pfStack_2338,&pfStack_2340,"db",&fStack_2108);
  pcStackY_2350 = (code *)0x10e3e4;
  fdb_kvs_open(pfStack_2338,&pfStack_2320,"db2",&fStack_2108);
  pcVar21 = acStack_20a8;
  doc = (fdb_doc **)0x6161616161616161;
  pcVar13 = acStack_2308;
  pcVar23 = (char *)0x0;
  do {
    pcStackY_2350 = (code *)0x10e410;
    sprintf(pcVar21,"%dkey",pcVar23);
    pfVar19 = pfStack_2340;
    builtin_strncpy(acStack_2308,"aaaaaaaaaaa",0xc);
    pcStackY_2350 = (code *)0x10e42f;
    sVar7 = strlen(pcVar21);
    pcStackY_2350 = (code *)0x10e43a;
    sVar5 = strlen(pcVar13);
    pcStackY_2350 = (code *)0x10e44e;
    fVar2 = fdb_set_kv(pfVar19,pcVar21,sVar7,pcVar13,sVar5);
    pfVar19 = pfStack_2320;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStackY_2350 = (code *)0x10e759;
      enter_reuse_via_separate_kvs_test();
LAB_0010e759:
      pcStackY_2350 = (code *)0x10e760;
      enter_reuse_via_separate_kvs_test();
LAB_0010e760:
      pcStackY_2350 = (code *)0x10e767;
      enter_reuse_via_separate_kvs_test();
      goto LAB_0010e767;
    }
    pcStackY_2350 = (code *)0x10e463;
    sVar7 = strlen(pcVar21);
    pcStackY_2350 = (code *)0x10e46e;
    sVar5 = strlen(pcVar13);
    pcStackY_2350 = (code *)0x10e482;
    fVar2 = fdb_set_kv(pfVar19,pcVar21,sVar7,pcVar13,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e759;
    pcStackY_2350 = (code *)0x10e499;
    fVar2 = fdb_commit(pfStack_2338,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e760;
    uVar16 = (int)pcVar23 + 1;
    pcVar23 = (char *)(ulong)uVar16;
  } while (uVar16 != 10);
  pcVar13 = (char *)0x0;
  pcVar23 = acStack_20a8;
  pcVar21 = acStack_2308;
  doc = (fdb_doc **)0x0;
  do {
    pfVar19 = pfStack_2340;
    builtin_strncpy(acStack_20a8,"0key",5);
    builtin_strncpy(acStack_2308,
                    "bbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbb"
                    ,0x80);
    pcStackY_2350 = (code *)0x10e521;
    sVar7 = strlen(pcVar23);
    pcStackY_2350 = (code *)0x10e52c;
    sVar5 = strlen(pcVar21);
    pcStackY_2350 = (code *)0x10e540;
    fVar2 = fdb_set_kv(pfVar19,pcVar23,sVar7,pcVar21,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e76e;
    pcStackY_2350 = (code *)0x10e55a;
    fVar2 = fdb_get_file_info(pfStack_2338,&fStack_20f0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e767;
    uVar16 = (int)doc + 1;
    doc = (fdb_doc **)(ulong)uVar16;
  } while (fStack_20f0.file_size < 0x1000000);
  pcStackY_2350 = (code *)0x10e580;
  sVar3 = sb_check_block_reusing(pfStack_2340);
  if (sVar3 == SBD_RECLAIM) {
    pcStackY_2350 = (code *)0x10e598;
    fVar2 = fdb_commit(pfStack_2338,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e786;
    pcVar21 = acStack_20a8;
    pcVar13 = acStack_2308;
    pcVar23 = (char *)0x0;
    do {
      pcStackY_2350 = (code *)0x10e5c2;
      sprintf(pcVar21,"key%d",pcVar23);
      pfVar19 = pfStack_2340;
      builtin_strncpy(acStack_2308,
                      "ccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccc"
                      ,0x80);
      pcStackY_2350 = (code *)0x10e612;
      sVar7 = strlen(pcVar21);
      pcStackY_2350 = (code *)0x10e61d;
      sVar5 = strlen(pcVar13);
      pcStackY_2350 = (code *)0x10e631;
      fVar2 = fdb_set_kv(pfVar19,pcVar21,sVar7,pcVar13,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e775;
      uVar20 = (int)pcVar23 + 1;
      pcVar23 = (char *)(ulong)uVar20;
    } while (uVar16 != uVar20);
    pcStackY_2350 = (code *)0x10e652;
    fVar2 = fdb_commit(pfStack_2338,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e78d;
    pcStackY_2350 = (code *)0x10e67a;
    fdb_iterator_init(pfStack_2320,&pfStack_2330,(void *)0x0,0,(void *)0x0,0,0);
    pcVar23 = (char *)0xa;
    doc = &pfStack_2328;
    do {
      pcStackY_2350 = (code *)0x10e691;
      fVar2 = fdb_iterator_get(pfStack_2330,doc);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e77c;
      pcStackY_2350 = (code *)0x10e6a3;
      fdb_doc_free(pfStack_2328);
      pfStack_2328 = (fdb_doc *)0x0;
      pcStackY_2350 = (code *)0x10e6b6;
      fVar2 = fdb_iterator_next(pfStack_2330);
      uVar16 = (int)pcVar23 - 1;
      pcVar23 = (char *)(ulong)uVar16;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    if (uVar16 != 0) goto LAB_0010e794;
    pcStackY_2350 = (code *)0x10e6cf;
    fdb_iterator_close(pfStack_2330);
    pcStackY_2350 = (code *)0x10e6d9;
    fVar2 = fdb_kvs_close(pfStack_2340);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e799;
    pcStackY_2350 = (code *)0x10e6eb;
    fVar2 = fdb_kvs_close(pfStack_2320);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStackY_2350 = (code *)0x10e6fd;
      fVar2 = fdb_close(pfStack_2338);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pcStackY_2350 = (code *)0x10e70a;
        fdb_shutdown();
        pcStackY_2350 = (code *)0x10e70f;
        memleak_end();
        pcVar21 = "%s PASSED\n";
        if (enter_reuse_via_separate_kvs_test()::__test_pass != '\0') {
          pcVar21 = "%s FAILED\n";
        }
        pcStackY_2350 = (code *)0x10e740;
        fprintf(_stderr,pcVar21,"enter reuse via separate kvs test");
        return;
      }
      goto LAB_0010e7a7;
    }
  }
  else {
LAB_0010e781:
    pcStackY_2350 = (code *)0x10e786;
    enter_reuse_via_separate_kvs_test();
LAB_0010e786:
    pcStackY_2350 = (code *)0x10e78d;
    enter_reuse_via_separate_kvs_test();
LAB_0010e78d:
    pcStackY_2350 = (code *)0x10e794;
    enter_reuse_via_separate_kvs_test();
LAB_0010e794:
    pcStackY_2350 = (code *)0x10e799;
    enter_reuse_via_separate_kvs_test();
LAB_0010e799:
    pcStackY_2350 = (code *)0x10e7a0;
    enter_reuse_via_separate_kvs_test();
  }
  pcStackY_2350 = (code *)0x10e7a7;
  enter_reuse_via_separate_kvs_test();
LAB_0010e7a7:
  pcStackY_2350 = child_function;
  enter_reuse_via_separate_kvs_test();
  ppfStackY_2378 = doc;
  sStackY_2368 = sVar7;
  pcStackY_2360 = pcVar21;
  pcStackY_2358 = pcVar13;
  pcStackY_2350 = (code *)pcVar23;
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  fStackY_2678.block_reusing_threshold = 0x41;
  fStackY_2678.num_keeping_headers = 5;
  fdb_open(&pfStackY_27a0,"./staleblktest1",&fStackY_2678);
  fdb_kvs_open(pfStackY_27a0,&pfStackY_27a8,"db",&fStackY_2798);
  iVar4 = 0;
  uVar12 = 0;
  do {
    sprintf(acStackY_2780,"key%d",uVar12);
    sprintf(acStackY_2580,"seqno%d",uVar12);
    pfVar19 = pfStackY_27a8;
    sVar5 = strlen(acStackY_2780);
    sVar7 = strlen(acStackY_2580);
    fdb_set_kv(pfVar19,acStackY_2780,sVar5,acStackY_2580,sVar7);
    if ((int)(uVar12 / 100) * 100 + iVar4 == 0) {
      fdb_commit(pfStackY_27a0,(int)(uVar12 / 500) * 500 + iVar4 == 0);
    }
    uVar12 = (ulong)((int)uVar12 + 1);
    iVar4 = iVar4 + -1;
  } while( true );
LAB_0010c694:
  pcStack_498 = (code *)0x10c69b;
  snapshot_after_block_reuse_test();
LAB_0010c69b:
  pcStack_498 = (code *)0x10c6a2;
  snapshot_after_block_reuse_test();
  goto LAB_0010c6a2;
LAB_0010c9d3:
  pcStack_650 = (code *)0x10c9da;
  snapshot_inmem_before_block_reuse_test();
LAB_0010c9da:
  pcStack_650 = (code *)0x10c9e1;
  snapshot_inmem_before_block_reuse_test();
LAB_0010c9e1:
  pcStack_650 = (code *)0x10c9e8;
  snapshot_inmem_before_block_reuse_test();
LAB_0010c9e8:
  pcStack_650 = (code *)0x10c9ef;
  snapshot_inmem_before_block_reuse_test();
  fVar2 = extraout_EAX_00;
  goto LAB_0010c9ef;
code_r0x0010cc6c:
  unaff_RBP = unaff_RBP + 0x400;
  if (unaff_RBP == 0xfff) goto code_r0x0010cc7c;
  goto LAB_0010cc13;
code_r0x0010cc7c:
  pcStack_938 = (code *)0x10cc8b;
  fVar2 = fdb_get_file_info(pfStack_928,&fStack_8b8);
  aVar24 = aStack_918;
  sVar18 = sStack_920;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d06a;
  handle.seqtree = (btree *)&(aStack_918.seqtree)->vsize;
  sVar6 = (size_t)((int)sStack_920 + 8);
  if (0xffffff < fStack_8b8.file_size) goto code_r0x0010ccb6;
  goto LAB_0010cc04;
LAB_0010d06a:
  pcStack_938 = (code *)0x10d071;
  variable_value_size_test();
LAB_0010d071:
  pcStack_938 = (code *)0x10d078;
  variable_value_size_test();
  aVar25 = handle;
LAB_0010d078:
  handle = aVar25;
  pcStack_938 = (code *)0x10d07f;
  variable_value_size_test();
LAB_0010d07f:
  pcStack_938 = (code *)0x10d086;
  variable_value_size_test();
  sVar18 = unaff_RBP;
  aVar24 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar23;
  goto LAB_0010d086;
code_r0x0010ccb6:
  pcStack_938 = (code *)0x10ccbf;
  sVar3 = sb_check_block_reusing((fdb_kvs_handle *)aStack_930.seqtree);
  if (sVar3 != SBD_RECLAIM) goto LAB_0010d08d;
  pcStack_938 = (code *)0x10ccd4;
  fVar2 = fdb_commit(pfStack_928,'\0');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d092;
  pcStack_938 = (code *)0x10ccf1;
  fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_930.seqtree,
                            (fdb_kvs_handle **)&aStack_900.seqtree,0xffffffffffffffff);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d099;
  if ((fdb_kvs_handle *)aVar24.seqtree != (fdb_kvs_handle *)0x0) {
    aStack_8f0.seqtree = aVar24.seqtree;
    pcVar21 = (char *)0x0;
    aStack_8e8 = handle;
    do {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = aVar24;
      uVar16 = (int)sVar18 + 1;
      pcStack_938 = (code *)0x10cd43;
      sprintf((char *)&fStack_870,"%d_key",(ulong)uVar16);
      sStack_920 = sVar18;
      aStack_918 = aVar24;
      if ((int)uVar16 < 2) {
        uVar12 = 0;
      }
      else {
        uVar12 = sVar18 & 0xffffffff;
        pcStack_938 = (code *)0x10cd65;
        memset(pcVar13,99,uVar12);
      }
      pcVar23 = (char *)aStack_930;
      pcVar13[uVar12] = '\0';
      pfVar22 = &fStack_870;
      pcStack_938 = (code *)0x10cd81;
      sVar5 = strlen((char *)pfVar22);
      unaff_RBP = sVar5 + 1;
      pcStack_938 = (code *)0x10cd8d;
      sVar5 = strlen(pcVar13);
      pcStack_938 = (code *)0x10cda2;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar23,pfVar22,unaff_RBP,pcVar13,sVar5 + 1);
      handle = aStack_8e8;
      aVar25 = SUB168(auVar1 * ZEXT816(0xcccccccccccccccd),8);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d078;
      if ((fdb_kvs_handle *)
          (&((fdb_kvs_config *)&(aStack_8e8.seqtree)->ksize)->create_if_missing +
          ~(((ulong)aVar24.seqtree / 5 & 0xfffffffffffffffe) * 5)) == (fdb_kvs_handle *)pcVar21) {
        pcStack_938 = (code *)0x10cddc;
        fVar2 = fdb_commit(pfStack_928,'\x01');
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d07f;
      }
      aVar24.seqtree = (btree *)((long)&aStack_918.seqtree[-1].aux + 7);
      pcVar21 = (char *)&((btree *)pcVar21)->vsize;
      sVar18 = (size_t)((int)sStack_920 - 8);
    } while (aStack_8f0.seqtree != (btree *)pcVar21);
  }
  pfVar22 = &fStack_870;
  pcStack_938 = (code *)0x10ce11;
  fVar2 = fdb_commit(pfStack_928,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0a0;
  aVar24.seqtree = (btree *)&fStack_870;
  pcStack_938 = (code *)0x10ce37;
  sprintf((char *)aVar24.seqtree,"%d_key",0x200);
  pcStack_938 = (code *)0x10ce49;
  memset(pcVar13,0x61,0x4fffff);
  pcVar21 = (char *)aStack_930;
  pcVar13[0x4fffff] = '\0';
  pcStack_938 = (code *)0x10ce5c;
  sVar5 = strlen((char *)aVar24.seqtree);
  pfVar22 = (fdb_config *)(sVar5 + 1);
  pcStack_938 = (code *)0x10ce68;
  sVar5 = strlen(pcVar13);
  pcStack_938 = (code *)0x10ce7d;
  fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar21,aVar24.seqtree,(size_t)pfVar22,pcVar13,sVar5 + 1);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0a7;
  pcStack_938 = (code *)0x10ce94;
  fVar2 = fdb_commit(pfStack_928,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0ae;
  pcStack_938 = (code *)0x10ceba;
  sprintf((char *)&fStack_870,"%d_key",0x200);
  pcStack_938 = (code *)0x10cecc;
  memset(pcVar13,0x61,0x1ff);
  pcVar21 = (char *)aStack_8f8;
  pcVar13[0x1ff] = '\0';
  pcStack_938 = (code *)0x10cee0;
  sVar5 = strlen((char *)&fStack_870);
  pcStack_938 = (code *)0x10cef9;
  fVar2 = fdb_get_kv((fdb_kvs_handle *)pcVar21,(btree *)&fStack_870,sVar5 + 1,&aStack_908.seqtree,
                     (size_t *)&pkStack_910);
  aVar25 = aStack_908;
  aVar24.seqtree = (btree *)&fStack_870;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0b5;
  pcStack_938 = (code *)0x10cf16;
  iVar4 = bcmp(pcVar13,aStack_908.seqtree,(size_t)pkStack_910);
  if (iVar4 != 0) goto LAB_0010d0bc;
  pcStack_938 = (code *)0x10cf26;
  fVar2 = fdb_free_block(aVar25.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0c4;
  aVar25.seqtree = (btree *)&fStack_870;
  pcStack_938 = (code *)0x10cf4c;
  sprintf((char *)aVar25.seqtree,"%d_key",0x800);
  pcStack_938 = (code *)0x10cf5e;
  memset(pcVar13,0x62,0x7ff);
  pcVar21 = (char *)aStack_900;
  pcVar13[0x7ff] = '\0';
  pcStack_938 = (code *)0x10cf72;
  sVar5 = strlen((char *)aVar25.seqtree);
  pcStack_938 = (code *)0x10cf8b;
  fVar2 = fdb_get_kv((fdb_kvs_handle *)pcVar21,aVar25.seqtree,sVar5 + 1,&aStack_908.seqtree,
                     (size_t *)&pkStack_910);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0cb;
  pcStack_938 = (code *)0x10cfa8;
  iVar4 = bcmp(pcVar13,aStack_908.seqtree,(size_t)pkStack_910);
  aVar25 = aStack_908;
  if (iVar4 != 0) goto LAB_0010d0d2;
  pcStack_938 = (code *)0x10cfb8;
  fVar2 = fdb_free_block(aStack_908.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0da;
  pcStack_938 = (code *)0x10cfc8;
  operator_delete__(pcVar13);
  pcStack_938 = (code *)0x10cfd1;
  fVar2 = fdb_kvs_close((fdb_kvs_handle *)aStack_930.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0e1;
  pcStack_938 = (code *)0x10cfe3;
  fVar2 = fdb_kvs_close((fdb_kvs_handle *)aStack_8f8.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0e8;
  pcStack_938 = (code *)0x10cff5;
  fVar2 = fdb_kvs_close((fdb_kvs_handle *)aStack_900.seqtree);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010d0ef;
  pcStack_938 = (code *)0x10d007;
  fVar2 = fdb_close(pfStack_928);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_938 = (code *)0x10d014;
    fdb_shutdown();
    pcStack_938 = (code *)0x10d019;
    memleak_end();
    pcVar21 = "%s PASSED\n";
    if (variable_value_size_test()::__test_pass != '\0') {
      pcVar21 = "%s FAILED\n";
    }
    pcStack_938 = (code *)0x10d04a;
    fprintf(_stderr,pcVar21,"variable value size test");
    return;
  }
  goto LAB_0010d0f6;
LAB_0010d44c:
  pcStack_1010 = (code *)0x10d453;
  rollback_with_num_keeping_headers();
LAB_0010d453:
  pcStack_1010 = (code *)0x10d45a;
  rollback_with_num_keeping_headers();
LAB_0010d45a:
  pcStack_1010 = (code *)0x10d461;
  rollback_with_num_keeping_headers();
  goto LAB_0010d461;
LAB_0010d9ef:
  pcStack_14f8 = (code *)0x10d9f6;
  crash_and_recover_with_num_keeping_test();
LAB_0010d9f6:
  pcStack_14f8 = (code *)0x10d9fd;
  crash_and_recover_with_num_keeping_test();
LAB_0010d9fd:
  pcStack_14f8 = (code *)0x10da04;
  crash_and_recover_with_num_keeping_test();
LAB_0010da04:
  pcStack_14f8 = (code *)0x10da0b;
  crash_and_recover_with_num_keeping_test();
LAB_0010da0b:
  pcStack_14f8 = (code *)0x10da12;
  crash_and_recover_with_num_keeping_test();
LAB_0010da12:
  pcStack_14f8 = (code *)0x10da19;
  crash_and_recover_with_num_keeping_test();
LAB_0010da19:
  pcStack_14f8 = (code *)0x10da20;
  crash_and_recover_with_num_keeping_test();
  goto LAB_0010da20;
LAB_0010de20:
  pfStack_19a0 = (fdb_kvs_handle *)0x10de27;
  reuse_on_delete_test();
LAB_0010de27:
  pfVar8 = pfVar9;
  pfStack_19a0 = (fdb_kvs_handle *)0x10de2e;
  reuse_on_delete_test();
LAB_0010de2e:
  pfStack_19a0 = (fdb_kvs_handle *)0x10de35;
  reuse_on_delete_test();
LAB_0010de35:
  pfStack_19a0 = (fdb_kvs_handle *)0x10de3c;
  reuse_on_delete_test();
  pfVar9 = pfVar8;
  goto LAB_0010de3c;
LAB_0010e2ca:
  pfStack_1e88 = (fdb_kvs_handle *)0x10e2d1;
  fragmented_reuse_test();
LAB_0010e2d1:
  pfStack_1e88 = (fdb_kvs_handle *)0x10e2d8;
  fragmented_reuse_test();
LAB_0010e2d8:
  pfStack_1e88 = (fdb_kvs_handle *)0x10e2df;
  fragmented_reuse_test();
LAB_0010e2df:
  pfStack_1e88 = (fdb_kvs_handle *)0x10e2e6;
  fragmented_reuse_test();
LAB_0010e2e6:
  pfStack_1e88 = (fdb_kvs_handle *)0x10e2ed;
  fragmented_reuse_test();
LAB_0010e2ed:
  pfStack_1e88 = (fdb_kvs_handle *)0x10e2f4;
  fragmented_reuse_test();
  goto LAB_0010e2f4;
LAB_0010e767:
  pcStackY_2350 = (code *)0x10e76e;
  enter_reuse_via_separate_kvs_test();
LAB_0010e76e:
  pcStackY_2350 = (code *)0x10e775;
  enter_reuse_via_separate_kvs_test();
LAB_0010e775:
  pcStackY_2350 = (code *)0x10e77c;
  enter_reuse_via_separate_kvs_test();
LAB_0010e77c:
  pcStackY_2350 = (code *)0x10e781;
  enter_reuse_via_separate_kvs_test();
  goto LAB_0010e781;
}

Assistant:

void snapshot_before_block_reuse_test(bool inmem) {
    memleak_start();
    TEST_INIT();

    int i, j, n, r;
    void *rvalue;
    size_t rvalue_len;
    char bodybuf[256];
    fdb_file_handle* dbfile;
    fdb_kvs_handle *db, *snap_db;
    fdb_status status;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    sb_decision_t sb_decision;
    fdb_file_info file_info;

    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    fconfig.num_keeping_headers = 1;
    status = fdb_open(&dbfile, "./staleblktest1", &fconfig);
    TEST_STATUS(status);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_STATUS(status);

    const char *key = "key";
    const char *val = "snp";

    // set key
    status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
    TEST_STATUS(status);

    // commit
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // open snapshot
    if (inmem) {
        status = fdb_snapshot_open(db, &snap_db, FDB_SNAPSHOT_INMEM);
        TEST_STATUS(status);
    } else {
        status = fdb_snapshot_open(db, &snap_db, 1);
        TEST_STATUS(status);
    }

    val = "val";

    // initial load to reuse
    i = 0;
    do {
        status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
        TEST_STATUS(status);
        i++;
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    } while (file_info.file_size <= SB_MIN_BLOCK_REUSING_FILESIZE);

    // 5 update cycles of created items
    for (n = 0; n < 5; n++) {
        for(j = 0; j < i; j++) {
            status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
            TEST_STATUS(status);
        }
        // commit
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // verify in reclaim mode
    sb_decision = sb_check_block_reusing(db);
    TEST_CHK(sb_decision == SBD_RECLAIM);

    // expect pre-reuse data retained
    status = fdb_get_kv(snap_db, key, strlen(key) + 1, &rvalue, &rvalue_len);
    TEST_STATUS(status);
    TEST_CMP(rvalue, (char *)"snp", rvalue_len);

    // close snapshot
    status = fdb_kvs_close(snap_db);
    TEST_STATUS(status);

    // do another update cycle
    for (j = 0; j < i; j++) {
        // commit
        status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
        TEST_STATUS(status);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // attempt to open again will fail
    status = fdb_snapshot_open(db, &snap_db, 1);
    if (status == FDB_RESULT_SUCCESS) {
        // close incase kv was unexpectedly opened
        status = fdb_kvs_close(snap_db);
        TEST_STATUS(status);
    }
    TEST_CHK(status == FDB_RESULT_NO_DB_INSTANCE);

    status = fdb_free_block(rvalue);
    TEST_STATUS(status);
    status = fdb_kvs_close(db);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf,"snapshot before block reuse test %s", inmem ?
            "in-mem snapshot" : "disk snapshot");
    TEST_RESULT(bodybuf);
}